

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [28];
  undefined1 auVar30 [28];
  undefined1 auVar31 [28];
  undefined1 auVar32 [28];
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  byte bVar40;
  uint uVar41;
  ulong uVar42;
  long lVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  int iVar113;
  float fVar114;
  undefined4 uVar115;
  vint4 bi_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vfloat4 a0;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar201;
  float fVar218;
  float fVar219;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar220;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar227;
  float fVar239;
  float fVar240;
  vfloat4 a0_3;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar241;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  vfloat4 b0_2;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  vfloat4 a0_4;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  int iVar284;
  undefined1 in_ZMM31 [64];
  undefined1 auVar285 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_4e0;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  uint auStack_410 [4];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar43;
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  uint uVar112;
  undefined1 auVar266 [32];
  
  PVar6 = prim[1];
  uVar42 = (ulong)(byte)PVar6;
  lVar45 = uVar42 * 0x25;
  fVar114 = *(float *)(prim + lVar45 + 0x12);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar50 = vsubps_avx(auVar50,*(undefined1 (*) [16])(prim + lVar45 + 6));
  auVar139._0_4_ = fVar114 * auVar50._0_4_;
  auVar139._4_4_ = fVar114 * auVar50._4_4_;
  auVar139._8_4_ = fVar114 * auVar50._8_4_;
  auVar139._12_4_ = fVar114 * auVar50._12_4_;
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 4 + 6)));
  auVar54._0_4_ = fVar114 * auVar51._0_4_;
  auVar54._4_4_ = fVar114 * auVar51._4_4_;
  auVar54._8_4_ = fVar114 * auVar51._8_4_;
  auVar54._12_4_ = fVar114 * auVar51._12_4_;
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 5 + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 6 + 6)));
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0xf + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar42 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1a + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1b + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1c + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar162._4_4_ = auVar54._0_4_;
  auVar162._0_4_ = auVar54._0_4_;
  auVar162._8_4_ = auVar54._0_4_;
  auVar162._12_4_ = auVar54._0_4_;
  auVar67 = vshufps_avx(auVar54,auVar54,0x55);
  auVar68 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar114 = auVar68._0_4_;
  auVar131._0_4_ = fVar114 * auVar52._0_4_;
  fVar244 = auVar68._4_4_;
  auVar131._4_4_ = fVar244 * auVar52._4_4_;
  fVar227 = auVar68._8_4_;
  auVar131._8_4_ = fVar227 * auVar52._8_4_;
  fVar239 = auVar68._12_4_;
  auVar131._12_4_ = fVar239 * auVar52._12_4_;
  auVar65._0_4_ = auVar61._0_4_ * fVar114;
  auVar65._4_4_ = auVar61._4_4_ * fVar244;
  auVar65._8_4_ = auVar61._8_4_ * fVar227;
  auVar65._12_4_ = auVar61._12_4_ * fVar239;
  auVar55._0_4_ = auVar66._0_4_ * fVar114;
  auVar55._4_4_ = auVar66._4_4_ * fVar244;
  auVar55._8_4_ = auVar66._8_4_ * fVar227;
  auVar55._12_4_ = auVar66._12_4_ * fVar239;
  auVar68 = vfmadd231ps_fma(auVar131,auVar67,auVar51);
  auVar72 = vfmadd231ps_fma(auVar65,auVar67,auVar64);
  auVar67 = vfmadd231ps_fma(auVar55,auVar63,auVar67);
  auVar70 = vfmadd231ps_fma(auVar68,auVar162,auVar50);
  auVar72 = vfmadd231ps_fma(auVar72,auVar162,auVar59);
  auVar71 = vfmadd231ps_fma(auVar67,auVar62,auVar162);
  auVar267._4_4_ = auVar139._0_4_;
  auVar267._0_4_ = auVar139._0_4_;
  auVar267._8_4_ = auVar139._0_4_;
  auVar267._12_4_ = auVar139._0_4_;
  auVar67 = vshufps_avx(auVar139,auVar139,0x55);
  auVar68 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar114 = auVar68._0_4_;
  auVar163._0_4_ = fVar114 * auVar52._0_4_;
  fVar244 = auVar68._4_4_;
  auVar163._4_4_ = fVar244 * auVar52._4_4_;
  fVar227 = auVar68._8_4_;
  auVar163._8_4_ = fVar227 * auVar52._8_4_;
  fVar239 = auVar68._12_4_;
  auVar163._12_4_ = fVar239 * auVar52._12_4_;
  auVar151._0_4_ = auVar61._0_4_ * fVar114;
  auVar151._4_4_ = auVar61._4_4_ * fVar244;
  auVar151._8_4_ = auVar61._8_4_ * fVar227;
  auVar151._12_4_ = auVar61._12_4_ * fVar239;
  auVar140._0_4_ = auVar66._0_4_ * fVar114;
  auVar140._4_4_ = auVar66._4_4_ * fVar244;
  auVar140._8_4_ = auVar66._8_4_ * fVar227;
  auVar140._12_4_ = auVar66._12_4_ * fVar239;
  auVar51 = vfmadd231ps_fma(auVar163,auVar67,auVar51);
  auVar52 = vfmadd231ps_fma(auVar151,auVar67,auVar64);
  auVar64 = vfmadd231ps_fma(auVar140,auVar67,auVar63);
  auVar53 = vfmadd231ps_fma(auVar51,auVar267,auVar50);
  auVar54 = vfmadd231ps_fma(auVar52,auVar267,auVar59);
  auVar91._16_16_ = in_YmmResult._16_16_;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar281 = ZEXT1664(auVar50);
  auVar55 = vfmadd231ps_fma(auVar64,auVar267,auVar62);
  auVar51 = vandps_avx512vl(auVar70,auVar50);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  uVar49 = vcmpps_avx512vl(auVar51,auVar190,1);
  bVar15 = (bool)((byte)uVar49 & 1);
  auVar56._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar70._0_4_;
  bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar70._4_4_;
  bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar70._8_4_;
  bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar70._12_4_;
  auVar51 = vandps_avx512vl(auVar72,auVar50);
  uVar49 = vcmpps_avx512vl(auVar51,auVar190,1);
  bVar15 = (bool)((byte)uVar49 & 1);
  auVar57._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar72._0_4_;
  bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar72._4_4_;
  bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar72._8_4_;
  bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar72._12_4_;
  auVar50 = vandps_avx512vl(auVar71,auVar50);
  uVar49 = vcmpps_avx512vl(auVar50,auVar190,1);
  bVar15 = (bool)((byte)uVar49 & 1);
  auVar58._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar71._0_4_;
  bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar71._4_4_;
  bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar71._8_4_;
  bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar71._12_4_;
  auVar50 = vrcp14ps_avx512vl(auVar56);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar282 = ZEXT1664(auVar51);
  auVar52 = vfnmadd213ps_avx512vl(auVar56,auVar50,auVar51);
  auVar70 = vfmadd132ps_fma(auVar52,auVar50,auVar50);
  auVar50 = vrcp14ps_avx512vl(auVar57);
  auVar52 = vfnmadd213ps_avx512vl(auVar57,auVar50,auVar51);
  auVar71 = vfmadd132ps_fma(auVar52,auVar50,auVar50);
  auVar50 = vrcp14ps_avx512vl(auVar58);
  auVar51 = vfnmadd213ps_avx512vl(auVar58,auVar50,auVar51);
  auVar69 = vfmadd132ps_fma(auVar51,auVar50,auVar50);
  fVar114 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar45 + 0x16)) *
            *(float *)(prim + lVar45 + 0x1a);
  auVar176._4_4_ = fVar114;
  auVar176._0_4_ = fVar114;
  auVar176._8_4_ = fVar114;
  auVar176._12_4_ = fVar114;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar42 * 7 + 6);
  auVar50 = vpmovsxwd_avx(auVar50);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar42 * 0xb + 6);
  auVar51 = vpmovsxwd_avx(auVar51);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar59 = vsubps_avx(auVar51,auVar50);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar42 * 9 + 6);
  auVar51 = vpmovsxwd_avx(auVar52);
  auVar52 = vfmadd213ps_fma(auVar59,auVar176,auVar50);
  auVar50 = vcvtdq2ps_avx(auVar51);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar42 * 0xd + 6);
  auVar51 = vpmovsxwd_avx(auVar59);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar51 = vsubps_avx(auVar51,auVar50);
  auVar59 = vfmadd213ps_fma(auVar51,auVar176,auVar50);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar42 * 0x12 + 6);
  auVar50 = vpmovsxwd_avx(auVar64);
  auVar50 = vcvtdq2ps_avx(auVar50);
  uVar49 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar42 * 2 + uVar49 + 6);
  auVar51 = vpmovsxwd_avx(auVar61);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar51 = vsubps_avx(auVar51,auVar50);
  auVar64 = vfmadd213ps_fma(auVar51,auVar176,auVar50);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar49 + 6);
  auVar50 = vpmovsxwd_avx(auVar62);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar42 * 0x18 + 6);
  auVar51 = vpmovsxwd_avx(auVar63);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar51 = vsubps_avx(auVar51,auVar50);
  auVar61 = vfmadd213ps_fma(auVar51,auVar176,auVar50);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar42 * 0x1d + 6);
  auVar50 = vpmovsxwd_avx(auVar66);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar42 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar51 = vpmovsxwd_avx(auVar67);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar51 = vsubps_avx(auVar51,auVar50);
  auVar62 = vfmadd213ps_fma(auVar51,auVar176,auVar50);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar42) + 6);
  auVar50 = vpmovsxwd_avx(auVar68);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar42 * 0x23 + 6);
  auVar51 = vpmovsxwd_avx(auVar72);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar51 = vsubps_avx(auVar51,auVar50);
  auVar51 = vfmadd213ps_fma(auVar51,auVar176,auVar50);
  auVar50 = vsubps_avx(auVar52,auVar53);
  auVar177._0_4_ = auVar70._0_4_ * auVar50._0_4_;
  auVar177._4_4_ = auVar70._4_4_ * auVar50._4_4_;
  auVar177._8_4_ = auVar70._8_4_ * auVar50._8_4_;
  auVar177._12_4_ = auVar70._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar59,auVar53);
  auVar132._0_4_ = auVar70._0_4_ * auVar50._0_4_;
  auVar132._4_4_ = auVar70._4_4_ * auVar50._4_4_;
  auVar132._8_4_ = auVar70._8_4_ * auVar50._8_4_;
  auVar132._12_4_ = auVar70._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar64,auVar54);
  auVar164._0_4_ = auVar71._0_4_ * auVar50._0_4_;
  auVar164._4_4_ = auVar71._4_4_ * auVar50._4_4_;
  auVar164._8_4_ = auVar71._8_4_ * auVar50._8_4_;
  auVar164._12_4_ = auVar71._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar61,auVar54);
  auVar120._0_4_ = auVar71._0_4_ * auVar50._0_4_;
  auVar120._4_4_ = auVar71._4_4_ * auVar50._4_4_;
  auVar120._8_4_ = auVar71._8_4_ * auVar50._8_4_;
  auVar120._12_4_ = auVar71._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar62,auVar55);
  auVar152._0_4_ = auVar69._0_4_ * auVar50._0_4_;
  auVar152._4_4_ = auVar69._4_4_ * auVar50._4_4_;
  auVar152._8_4_ = auVar69._8_4_ * auVar50._8_4_;
  auVar152._12_4_ = auVar69._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar51,auVar55);
  auVar60._0_4_ = auVar69._0_4_ * auVar50._0_4_;
  auVar60._4_4_ = auVar69._4_4_ * auVar50._4_4_;
  auVar60._8_4_ = auVar69._8_4_ * auVar50._8_4_;
  auVar60._12_4_ = auVar69._12_4_ * auVar50._12_4_;
  auVar50 = vpminsd_avx(auVar177,auVar132);
  auVar51 = vpminsd_avx(auVar164,auVar120);
  auVar50 = vmaxps_avx(auVar50,auVar51);
  auVar51 = vpminsd_avx(auVar152,auVar60);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar70._4_4_ = uVar115;
  auVar70._0_4_ = uVar115;
  auVar70._8_4_ = uVar115;
  auVar70._12_4_ = uVar115;
  auVar51 = vmaxps_avx512vl(auVar51,auVar70);
  auVar50 = vmaxps_avx(auVar50,auVar51);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_3e0 = vmulps_avx512vl(auVar50,auVar71);
  auVar50 = vpmaxsd_avx(auVar177,auVar132);
  auVar51 = vpmaxsd_avx(auVar164,auVar120);
  auVar50 = vminps_avx(auVar50,auVar51);
  auVar51 = vpmaxsd_avx(auVar152,auVar60);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar69._4_4_ = uVar115;
  auVar69._0_4_ = uVar115;
  auVar69._8_4_ = uVar115;
  auVar69._12_4_ = uVar115;
  auVar51 = vminps_avx512vl(auVar51,auVar69);
  auVar50 = vminps_avx(auVar50,auVar51);
  auVar53._8_4_ = 0x3f800003;
  auVar53._0_8_ = 0x3f8000033f800003;
  auVar53._12_4_ = 0x3f800003;
  auVar50 = vmulps_avx512vl(auVar50,auVar53);
  auVar51 = vpbroadcastd_avx512vl();
  uVar23 = vcmpps_avx512vl(local_3e0,auVar50,2);
  uVar49 = vpcmpgtd_avx512vl(auVar51,_DAT_01ff0cf0);
  uVar49 = ((byte)uVar23 & 0xf) & uVar49;
  if ((char)uVar49 == '\0') {
    return;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar50 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar285 = ZEXT1664(auVar50);
  auVar91._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar280 = ZEXT1664(auVar91._0_16_);
LAB_01c245ec:
  lVar45 = 0;
  for (uVar42 = uVar49; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    lVar45 = lVar45 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar48].ptr;
  fVar114 = (pGVar9->time_range).lower;
  fVar114 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar114) / ((pGVar9->time_range).upper - fVar114));
  auVar50 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
  uVar7 = *(uint *)(prim + lVar45 * 4 + 6);
  auVar50 = vminss_avx(auVar50,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar87._16_16_ = auVar91._16_16_;
  auVar53 = vmaxss_avx512f(auVar285._0_16_,auVar50);
  uVar42 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar44 = (long)(int)auVar53._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar44);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar44);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar42);
  lVar45 = uVar42 + 1;
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar45);
  lVar1 = uVar42 + 2;
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar42 + 3;
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar44);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar44);
  auVar64 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar42);
  auVar61 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar45);
  auVar62 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar63 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar44);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar44);
  auVar66 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar42);
  auVar67 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar45);
  auVar68 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar72 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar44);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar44);
  auVar70 = *(undefined1 (*) [16])(lVar12 + uVar42 * lVar11);
  auVar71 = *(undefined1 (*) [16])(lVar12 + lVar45 * lVar11);
  auVar69 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar53 = vsubss_avx512f(ZEXT416((uint)fVar114),auVar53);
  auVar87._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar54 = vmulps_avx512vl(auVar59,auVar87._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar87._0_16_);
  auVar55 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar51,auVar54);
  auVar55 = vaddps_avx512vl(auVar50,auVar55);
  auVar120 = auVar280._0_16_;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar120);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar50,auVar120);
  auVar56 = vmulps_avx512vl(auVar63,auVar87._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar62,auVar87._0_16_);
  auVar57 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar61,auVar56);
  auVar58 = vaddps_avx512vl(auVar64,auVar57);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar120);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar64,auVar120);
  auVar57 = vxorps_avx512vl(auVar57,auVar57);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar52,auVar59);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar51,auVar87._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar50,auVar87._0_16_);
  auVar59 = vmulps_avx512vl(auVar59,auVar120);
  auVar52 = vfnmadd231ps_avx512vl(auVar59,auVar120,auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar52,auVar87._0_16_,auVar51);
  auVar91._16_16_ = vfnmadd231ps_avx512vl(auVar51,auVar87._0_16_,auVar50);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar62,auVar63);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar61,auVar87._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar50,auVar64,auVar87._0_16_);
  auVar50 = vmulps_avx512vl(auVar63,auVar120);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar120,auVar62);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar87._0_16_,auVar61);
  auVar61 = vfnmadd231ps_avx512vl(auVar50,auVar87._0_16_,auVar64);
  auVar51 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar50 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar50 = vmulps_avx512vl(auVar54,auVar50);
  auVar50 = vfmsub231ps_avx512vl(auVar50,auVar51,auVar58);
  auVar52 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar50 = vmulps_avx512vl(auVar54,auVar50);
  auVar50 = vfmsub231ps_fma(auVar50,auVar51,auVar56);
  auVar59 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar91._16_16_,auVar91._16_16_,0xc9);
  auVar51 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar178._0_4_ = auVar91._16_4_ * auVar51._0_4_;
  auVar178._4_4_ = auVar91._20_4_ * auVar51._4_4_;
  auVar178._8_4_ = auVar91._24_4_ * auVar51._8_4_;
  auVar178._12_4_ = auVar91._28_4_ * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar178,auVar50,auVar60);
  auVar64 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar179._0_4_ = auVar91._16_4_ * auVar51._0_4_;
  auVar179._4_4_ = auVar91._20_4_ * auVar51._4_4_;
  auVar179._8_4_ = auVar91._24_4_ * auVar51._8_4_;
  auVar179._12_4_ = auVar91._28_4_ * auVar51._12_4_;
  auVar50 = vfmsub231ps_fma(auVar179,auVar50,auVar61);
  auVar61 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar73._4_28_ = auVar87._4_28_;
  auVar73._0_4_ = auVar50._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar73._0_16_);
  auVar62 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  auVar63 = vmulss_avx512f(auVar63,auVar51);
  auVar51 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  fVar227 = auVar62._0_4_ - auVar51._0_4_;
  auVar202._4_4_ = fVar227;
  auVar202._0_4_ = fVar227;
  auVar202._8_4_ = fVar227;
  auVar202._12_4_ = fVar227;
  auVar51 = vdpps_avx(auVar52,auVar59,0x7f);
  auVar62 = vmulps_avx512vl(auVar52,auVar202);
  auVar63 = vbroadcastss_avx512vl(auVar50);
  auVar59 = vmulps_avx512vl(auVar63,auVar59);
  fVar114 = auVar51._0_4_;
  auVar165._0_4_ = fVar114 * auVar52._0_4_;
  auVar165._4_4_ = fVar114 * auVar52._4_4_;
  auVar165._8_4_ = fVar114 * auVar52._8_4_;
  auVar165._12_4_ = fVar114 * auVar52._12_4_;
  auVar52 = vsubps_avx(auVar59,auVar165);
  auVar51 = vrcp14ss_avx512f(auVar87._0_16_,auVar73._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar51,ZEXT416(0x40000000));
  fVar114 = auVar51._0_4_ * auVar50._0_4_;
  auVar50 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar89._16_16_ = auVar87._16_16_;
  auVar89._0_16_ = auVar87._0_16_;
  auVar90._4_28_ = auVar89._4_28_;
  auVar90._0_4_ = auVar50._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar90._0_16_);
  auVar59 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  fVar244 = auVar51._0_4_;
  fVar239 = auVar59._0_4_ - auVar63._0_4_ * fVar244 * fVar244 * fVar244;
  auVar203._0_4_ = auVar64._0_4_ * fVar239;
  auVar203._4_4_ = auVar64._4_4_ * fVar239;
  auVar203._8_4_ = auVar64._8_4_ * fVar239;
  auVar203._12_4_ = auVar64._12_4_ * fVar239;
  auVar51 = vdpps_avx(auVar64,auVar61,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar50);
  auVar59 = vmulps_avx512vl(auVar59,auVar61);
  fVar244 = auVar51._0_4_;
  auVar121._0_4_ = fVar244 * auVar64._0_4_;
  auVar121._4_4_ = fVar244 * auVar64._4_4_;
  auVar121._8_4_ = fVar244 * auVar64._8_4_;
  auVar121._12_4_ = fVar244 * auVar64._12_4_;
  auVar51 = vsubps_avx(auVar59,auVar121);
  auVar59 = vrcp14ss_avx512f(auVar87._0_16_,auVar90._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar59,ZEXT416(0x40000000));
  fVar244 = auVar59._0_4_ * auVar50._0_4_;
  auVar50 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar59 = vmulps_avx512vl(auVar50,auVar62);
  auVar56 = vsubps_avx512vl(auVar55,auVar59);
  auVar64 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar64 = vmulps_avx512vl(auVar64,auVar62);
  auVar153._0_4_ = auVar64._0_4_ + auVar50._0_4_ * fVar227 * fVar114 * auVar52._0_4_;
  auVar153._4_4_ = auVar64._4_4_ + auVar50._4_4_ * fVar227 * fVar114 * auVar52._4_4_;
  auVar153._8_4_ = auVar64._8_4_ + auVar50._8_4_ * fVar227 * fVar114 * auVar52._8_4_;
  auVar153._12_4_ = auVar64._12_4_ + auVar50._12_4_ * fVar227 * fVar114 * auVar52._12_4_;
  auVar52 = vsubps_avx512vl(auVar54,auVar153);
  auVar55 = vaddps_avx512vl(auVar55,auVar59);
  auVar59 = vaddps_avx512vl(auVar54,auVar153);
  auVar50 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar64 = vmulps_avx512vl(auVar50,auVar203);
  auVar54 = vsubps_avx512vl(auVar57,auVar64);
  auVar61 = vshufps_avx512vl(auVar91._16_16_,auVar91._16_16_,0xff);
  auVar62 = vmulps_avx512vl(auVar61,auVar203);
  auVar204._0_4_ = auVar62._0_4_ + auVar50._0_4_ * fVar239 * auVar51._0_4_ * fVar244;
  auVar204._4_4_ = auVar62._4_4_ + auVar50._4_4_ * fVar239 * auVar51._4_4_ * fVar244;
  auVar204._8_4_ = auVar62._8_4_ + auVar50._8_4_ * fVar239 * auVar51._8_4_ * fVar244;
  auVar204._12_4_ = auVar62._12_4_ + auVar50._12_4_ * fVar239 * auVar51._12_4_ * fVar244;
  auVar50 = vsubps_avx(auVar91._16_16_,auVar204);
  auVar57 = vaddps_avx512vl(auVar57,auVar64);
  auVar51 = vaddps_avx512vl(auVar91._16_16_,auVar204);
  auVar116._8_4_ = 0x3eaaaaab;
  auVar116._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar116._12_4_ = 0x3eaaaaab;
  auVar191._0_4_ = auVar56._0_4_ + auVar52._0_4_ * 0.33333334;
  auVar191._4_4_ = auVar56._4_4_ + auVar52._4_4_ * 0.33333334;
  auVar191._8_4_ = auVar56._8_4_ + auVar52._8_4_ * 0.33333334;
  auVar191._12_4_ = auVar56._12_4_ + auVar52._12_4_ * 0.33333334;
  auVar180._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar180._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar180._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar180._12_4_ = auVar50._12_4_ * 0.33333334;
  auVar62 = vsubps_avx(auVar54,auVar180);
  auVar166._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar166._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar166._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar166._12_4_ = auVar59._12_4_ * 0.33333334;
  auVar58 = vaddps_avx512vl(auVar55,auVar166);
  auVar50 = vmulps_avx512vl(auVar51,auVar116);
  auVar63 = vsubps_avx(auVar57,auVar50);
  auVar50 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar52 = vmulps_avx512vl(auVar72,auVar87._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar68,auVar87._0_16_);
  auVar51 = vxorps_avx512vl(auVar51,auVar51);
  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar67,auVar52);
  auVar91._16_16_ = vaddps_avx512vl(auVar66,auVar51);
  auVar51 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar120);
  auVar60 = vfnmadd231ps_avx512vl(auVar51,auVar66,auVar120);
  auVar51 = vmulps_avx512vl(auVar50,auVar87._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar69,auVar87._0_16_);
  auVar52 = vxorps_avx512vl(auVar61,auVar61);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar71,auVar51);
  auVar59 = vaddps_avx512vl(auVar70,auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar120);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar70,auVar120);
  auVar52 = vxorps_avx512vl(auVar52,auVar52);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar68,auVar72);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar87._0_16_);
  auVar65 = vfmadd231ps_avx512vl(auVar52,auVar66,auVar87._0_16_);
  auVar52 = vmulps_avx512vl(auVar72,auVar120);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar120,auVar68);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar87._0_16_,auVar67);
  auVar66 = vfnmadd231ps_avx512vl(auVar52,auVar87._0_16_,auVar66);
  auVar52 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar69,auVar50);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar87._0_16_);
  auVar64 = vfmadd231ps_avx512vl(auVar52,auVar70,auVar87._0_16_);
  auVar50 = vmulps_avx512vl(auVar50,auVar120);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar120,auVar69);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar87._0_16_,auVar71);
  auVar61 = vfnmadd231ps_avx512vl(auVar50,auVar87._0_16_,auVar70);
  auVar50 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar52 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  fVar239 = auVar60._0_4_;
  auVar251._0_4_ = fVar239 * auVar52._0_4_;
  fVar240 = auVar60._4_4_;
  auVar251._4_4_ = fVar240 * auVar52._4_4_;
  fVar241 = auVar60._8_4_;
  auVar251._8_4_ = fVar241 * auVar52._8_4_;
  fVar242 = auVar60._12_4_;
  auVar251._12_4_ = fVar242 * auVar52._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar251,auVar50,auVar59);
  auVar52 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar59 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar260._0_4_ = fVar239 * auVar59._0_4_;
  auVar260._4_4_ = fVar240 * auVar59._4_4_;
  auVar260._8_4_ = fVar241 * auVar59._8_4_;
  auVar260._12_4_ = fVar242 * auVar59._12_4_;
  auVar50 = vfmsub231ps_avx512vl(auVar260,auVar50,auVar51);
  auVar59 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar67 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  auVar50 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar50 = vmulps_avx512vl(auVar66,auVar50);
  auVar50 = vfmsub231ps_fma(auVar50,auVar67,auVar64);
  auVar64 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar51 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar50 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar51 = vmulps_avx512vl(auVar66,auVar51);
  auVar51 = vfmsub231ps_fma(auVar51,auVar67,auVar61);
  auVar61 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar74._16_16_ = auVar87._16_16_;
  auVar74._0_16_ = auVar87._0_16_;
  auVar75._4_28_ = auVar74._4_28_;
  auVar75._0_4_ = auVar50._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar75._0_16_);
  auVar67 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar68 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  auVar68 = vmulss_avx512f(auVar68,auVar51);
  auVar51 = vmulss_avx512f(auVar68,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  auVar51 = vsubss_avx512f(auVar67,auVar51);
  auVar274._0_4_ = auVar51._0_4_;
  auVar274._4_4_ = auVar274._0_4_;
  auVar274._8_4_ = auVar274._0_4_;
  auVar274._12_4_ = auVar274._0_4_;
  auVar67 = vmulps_avx512vl(auVar52,auVar274);
  auVar51 = vdpps_avx(auVar52,auVar59,0x7f);
  auVar68 = vbroadcastss_avx512vl(auVar50);
  auVar59 = vmulps_avx512vl(auVar68,auVar59);
  fVar114 = auVar51._0_4_;
  auVar181._0_4_ = auVar52._0_4_ * fVar114;
  auVar181._4_4_ = auVar52._4_4_ * fVar114;
  auVar181._8_4_ = auVar52._8_4_ * fVar114;
  auVar181._12_4_ = auVar52._12_4_ * fVar114;
  auVar52 = vsubps_avx(auVar59,auVar181);
  auVar51 = vrcp14ss_avx512f(auVar87._0_16_,auVar75._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar51,ZEXT416(0x40000000));
  fVar114 = auVar51._0_4_ * auVar50._0_4_;
  auVar50 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar76._16_16_ = auVar87._16_16_;
  auVar76._0_16_ = auVar87._0_16_;
  auVar77._4_28_ = auVar76._4_28_;
  auVar77._0_4_ = auVar50._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar77._0_16_);
  auVar59 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar68 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar244 = auVar51._0_4_;
  fVar227 = auVar59._0_4_ - auVar68._0_4_ * fVar244 * fVar244 * fVar244;
  auVar268._0_4_ = auVar64._0_4_ * fVar227;
  auVar268._4_4_ = auVar64._4_4_ * fVar227;
  auVar268._8_4_ = auVar64._8_4_ * fVar227;
  auVar268._12_4_ = auVar64._12_4_ * fVar227;
  auVar51 = vdpps_avx(auVar64,auVar61,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar50);
  auVar59 = vmulps_avx512vl(auVar59,auVar61);
  fVar244 = auVar51._0_4_;
  auVar228._0_4_ = auVar64._0_4_ * fVar244;
  auVar228._4_4_ = auVar64._4_4_ * fVar244;
  auVar228._8_4_ = auVar64._8_4_ * fVar244;
  auVar228._12_4_ = auVar64._12_4_ * fVar244;
  auVar51 = vsubps_avx(auVar59,auVar228);
  auVar59 = vrcp14ss_avx512f(auVar87._0_16_,auVar77._0_16_);
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar59,ZEXT416(0x40000000));
  auVar283 = ZEXT464(0x3f800000);
  fVar244 = auVar50._0_4_ * auVar59._0_4_;
  auVar59 = vshufps_avx512vl(auVar91._16_16_,auVar91._16_16_,0xff);
  auVar64 = vmulps_avx512vl(auVar59,auVar67);
  auVar61 = vsubps_avx512vl(auVar91._16_16_,auVar64);
  auVar50 = vshufps_avx(auVar60,auVar60,0xff);
  auVar50 = vmulps_avx512vl(auVar50,auVar67);
  auVar167._0_4_ = auVar50._0_4_ + auVar59._0_4_ * auVar274._0_4_ * fVar114 * auVar52._0_4_;
  auVar167._4_4_ = auVar50._4_4_ + auVar59._4_4_ * auVar274._0_4_ * fVar114 * auVar52._4_4_;
  auVar167._8_4_ = auVar50._8_4_ + auVar59._8_4_ * auVar274._0_4_ * fVar114 * auVar52._8_4_;
  auVar167._12_4_ = auVar50._12_4_ + auVar59._12_4_ * auVar274._0_4_ * fVar114 * auVar52._12_4_;
  auVar50 = vsubps_avx(auVar60,auVar167);
  auVar52 = vaddps_avx512vl(auVar91._16_16_,auVar64);
  auVar59 = vshufps_avx512vl(auVar65,auVar65,0xff);
  auVar261._0_4_ = auVar59._0_4_ * auVar268._0_4_;
  auVar261._4_4_ = auVar59._4_4_ * auVar268._4_4_;
  auVar261._8_4_ = auVar59._8_4_ * auVar268._8_4_;
  auVar261._12_4_ = auVar59._12_4_ * auVar268._12_4_;
  auVar64 = vsubps_avx512vl(auVar65,auVar261);
  auVar67 = vshufps_avx512vl(auVar66,auVar66,0xff);
  auVar67 = vmulps_avx512vl(auVar67,auVar268);
  auVar182._0_4_ = auVar67._0_4_ + auVar59._0_4_ * fVar227 * auVar51._0_4_ * fVar244;
  auVar182._4_4_ = auVar67._4_4_ + auVar59._4_4_ * fVar227 * auVar51._4_4_ * fVar244;
  auVar182._8_4_ = auVar67._8_4_ + auVar59._8_4_ * fVar227 * auVar51._8_4_ * fVar244;
  auVar182._12_4_ = auVar67._12_4_ + auVar59._12_4_ * fVar227 * auVar51._12_4_ * fVar244;
  auVar51 = vsubps_avx512vl(auVar66,auVar182);
  auVar59 = vaddps_avx512vl(auVar65,auVar261);
  auVar66 = vaddps_avx512vl(auVar66,auVar182);
  auVar229._0_4_ = auVar61._0_4_ + auVar50._0_4_ * 0.33333334;
  auVar229._4_4_ = auVar61._4_4_ + auVar50._4_4_ * 0.33333334;
  auVar229._8_4_ = auVar61._8_4_ + auVar50._8_4_ * 0.33333334;
  auVar229._12_4_ = auVar61._12_4_ + auVar50._12_4_ * 0.33333334;
  auVar221._0_4_ = auVar51._0_4_ * 0.33333334;
  auVar221._4_4_ = auVar51._4_4_ * 0.33333334;
  auVar221._8_4_ = auVar51._8_4_ * 0.33333334;
  auVar221._12_4_ = auVar51._12_4_ * 0.33333334;
  auVar50 = vsubps_avx(auVar64,auVar221);
  auVar168._0_4_ = auVar52._0_4_ + (fVar239 + auVar167._0_4_) * 0.33333334;
  auVar168._4_4_ = auVar52._4_4_ + (fVar240 + auVar167._4_4_) * 0.33333334;
  auVar168._8_4_ = auVar52._8_4_ + (fVar241 + auVar167._8_4_) * 0.33333334;
  auVar168._12_4_ = auVar52._12_4_ + (fVar242 + auVar167._12_4_) * 0.33333334;
  auVar183._0_4_ = auVar66._0_4_ * 0.33333334;
  auVar183._4_4_ = auVar66._4_4_ * 0.33333334;
  auVar183._8_4_ = auVar66._8_4_ * 0.33333334;
  auVar183._12_4_ = auVar66._12_4_ * 0.33333334;
  auVar51 = vsubps_avx(auVar59,auVar183);
  auVar66 = vbroadcastss_avx512vl(auVar53);
  auVar67 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
  auVar117._0_4_ = auVar67._0_4_;
  auVar117._4_4_ = auVar117._0_4_;
  auVar117._8_4_ = auVar117._0_4_;
  auVar117._12_4_ = auVar117._0_4_;
  auVar61 = vmulps_avx512vl(auVar66,auVar61);
  auVar67 = vmulps_avx512vl(auVar66,auVar229);
  auVar50 = vmulps_avx512vl(auVar66,auVar50);
  auVar275._0_4_ = auVar66._0_4_ * auVar64._0_4_;
  auVar275._4_4_ = auVar66._4_4_ * auVar64._4_4_;
  auVar275._8_4_ = auVar66._8_4_ * auVar64._8_4_;
  auVar275._12_4_ = auVar66._12_4_ * auVar64._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar61,auVar117,auVar56);
  local_330 = vfmadd231ps_avx512vl(auVar67,auVar117,auVar191);
  local_340 = vfmadd231ps_avx512vl(auVar50,auVar117,auVar62);
  local_350 = vfmadd231ps_fma(auVar275,auVar117,auVar54);
  auVar50 = vmulps_avx512vl(auVar66,auVar52);
  auVar52 = vmulps_avx512vl(auVar66,auVar168);
  auVar51 = vmulps_avx512vl(auVar66,auVar51);
  auVar262._0_4_ = auVar66._0_4_ * auVar59._0_4_;
  auVar262._4_4_ = auVar66._4_4_ * auVar59._4_4_;
  auVar262._8_4_ = auVar66._8_4_ * auVar59._8_4_;
  auVar262._12_4_ = auVar66._12_4_ * auVar59._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar50,auVar117,auVar55);
  _local_370 = vfmadd231ps_avx512vl(auVar52,auVar117,auVar58);
  _local_380 = vfmadd231ps_avx512vl(auVar51,auVar117,auVar63);
  _local_390 = vfmadd231ps_fma(auVar262,auVar117,auVar57);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar114 = *(float *)(ray + k * 4 + 0x60);
  local_2a0 = vsubps_avx512vl(local_320,auVar50);
  uVar115 = local_2a0._0_4_;
  auVar122._4_4_ = uVar115;
  auVar122._0_4_ = uVar115;
  auVar122._8_4_ = uVar115;
  auVar122._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar52 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar244 = pre->ray_space[k].vz.field_0.m128[0];
  fVar227 = pre->ray_space[k].vz.field_0.m128[1];
  fVar239 = pre->ray_space[k].vz.field_0.m128[2];
  fVar240 = pre->ray_space[k].vz.field_0.m128[3];
  auVar118._0_4_ = fVar244 * auVar52._0_4_;
  auVar118._4_4_ = fVar227 * auVar52._4_4_;
  auVar118._8_4_ = fVar239 * auVar52._8_4_;
  auVar118._12_4_ = fVar240 * auVar52._12_4_;
  auVar51 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar51);
  auVar62 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar122);
  local_2b0 = vsubps_avx512vl(local_330,auVar50);
  uVar115 = local_2b0._0_4_;
  auVar133._4_4_ = uVar115;
  auVar133._0_4_ = uVar115;
  auVar133._8_4_ = uVar115;
  auVar133._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar52 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar123._0_4_ = fVar244 * auVar52._0_4_;
  auVar123._4_4_ = fVar227 * auVar52._4_4_;
  auVar123._8_4_ = fVar239 * auVar52._8_4_;
  auVar123._12_4_ = fVar240 * auVar52._12_4_;
  auVar51 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar5,auVar51);
  auVar63 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar133);
  local_2c0 = vsubps_avx512vl(local_340,auVar50);
  uVar115 = local_2c0._0_4_;
  auVar184._4_4_ = uVar115;
  auVar184._0_4_ = uVar115;
  auVar184._8_4_ = uVar115;
  auVar184._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar52 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar134._0_4_ = fVar244 * auVar52._0_4_;
  auVar134._4_4_ = fVar227 * auVar52._4_4_;
  auVar134._8_4_ = fVar239 * auVar52._8_4_;
  auVar134._12_4_ = fVar240 * auVar52._12_4_;
  auVar51 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar5,auVar51);
  auVar66 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar184);
  local_2d0 = vsubps_avx(local_350,auVar50);
  uVar115 = local_2d0._0_4_;
  auVar205._4_4_ = uVar115;
  auVar205._0_4_ = uVar115;
  auVar205._8_4_ = uVar115;
  auVar205._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar52 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar185._0_4_ = fVar244 * auVar52._0_4_;
  auVar185._4_4_ = fVar227 * auVar52._4_4_;
  auVar185._8_4_ = fVar239 * auVar52._8_4_;
  auVar185._12_4_ = fVar240 * auVar52._12_4_;
  auVar51 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar51);
  auVar67 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar205);
  local_2e0 = vsubps_avx512vl(_local_360,auVar50);
  uVar115 = local_2e0._0_4_;
  auVar206._4_4_ = uVar115;
  auVar206._0_4_ = uVar115;
  auVar206._8_4_ = uVar115;
  auVar206._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar52 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar230._0_4_ = auVar52._0_4_ * fVar244;
  auVar230._4_4_ = auVar52._4_4_ * fVar227;
  auVar230._8_4_ = auVar52._8_4_ * fVar239;
  auVar230._12_4_ = auVar52._12_4_ * fVar240;
  auVar51 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar51);
  auVar68 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar206);
  local_2f0 = vsubps_avx512vl(_local_370,auVar50);
  uVar115 = local_2f0._0_4_;
  auVar207._4_4_ = uVar115;
  auVar207._0_4_ = uVar115;
  auVar207._8_4_ = uVar115;
  auVar207._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar52 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar245._0_4_ = auVar52._0_4_ * fVar244;
  auVar245._4_4_ = auVar52._4_4_ * fVar227;
  auVar245._8_4_ = auVar52._8_4_ * fVar239;
  auVar245._12_4_ = auVar52._12_4_ * fVar240;
  auVar51 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar5,auVar51);
  auVar72 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar207);
  local_300 = vsubps_avx512vl(_local_380,auVar50);
  uVar115 = local_300._0_4_;
  auVar208._4_4_ = uVar115;
  auVar208._0_4_ = uVar115;
  auVar208._8_4_ = uVar115;
  auVar208._12_4_ = uVar115;
  auVar51 = vshufps_avx(local_300,local_300,0x55);
  auVar52 = vshufps_avx(local_300,local_300,0xaa);
  auVar252._0_4_ = auVar52._0_4_ * fVar244;
  auVar252._4_4_ = auVar52._4_4_ * fVar227;
  auVar252._8_4_ = auVar52._8_4_ * fVar239;
  auVar252._12_4_ = auVar52._12_4_ * fVar240;
  auVar51 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar5,auVar51);
  auVar70 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar208);
  local_310 = vsubps_avx(_local_390,auVar50);
  uVar115 = local_310._0_4_;
  auVar154._4_4_ = uVar115;
  auVar154._0_4_ = uVar115;
  auVar154._8_4_ = uVar115;
  auVar154._12_4_ = uVar115;
  auVar50 = vshufps_avx(local_310,local_310,0x55);
  auVar51 = vshufps_avx(local_310,local_310,0xaa);
  auVar192._0_4_ = auVar51._0_4_ * fVar244;
  auVar192._4_4_ = auVar51._4_4_ * fVar227;
  auVar192._8_4_ = auVar51._8_4_ * fVar239;
  auVar192._12_4_ = auVar51._12_4_ * fVar240;
  auVar50 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar50);
  auVar71 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar4,auVar154);
  auVar61 = vmovlhps_avx512f(auVar62,auVar68);
  auVar52 = vmovlhps_avx(auVar63,auVar72);
  auVar59 = vmovlhps_avx(auVar66,auVar70);
  _local_4a0 = vmovlhps_avx(auVar67,auVar71);
  auVar51 = vminps_avx512vl(auVar61,auVar52);
  auVar64 = vmaxps_avx512vl(auVar61,auVar52);
  auVar50 = vminps_avx(auVar59,_local_4a0);
  auVar51 = vminps_avx(auVar51,auVar50);
  auVar50 = vmaxps_avx(auVar59,_local_4a0);
  auVar50 = vmaxps_avx(auVar64,auVar50);
  auVar64 = vshufpd_avx(auVar51,auVar51,3);
  auVar51 = vminps_avx(auVar51,auVar64);
  auVar64 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vmaxps_avx(auVar50,auVar64);
  auVar51 = vandps_avx512vl(auVar51,auVar281._0_16_);
  auVar50 = vandps_avx512vl(auVar50,auVar281._0_16_);
  auVar50 = vmaxps_avx(auVar51,auVar50);
  auVar51 = vmovshdup_avx(auVar50);
  auVar50 = vmaxss_avx(auVar51,auVar50);
  local_420 = vmovddup_avx512vl(auVar62);
  local_430 = vmovddup_avx512vl(auVar63);
  local_440 = vmovddup_avx512vl(auVar66);
  local_450._0_8_ = auVar67._0_8_;
  local_450._8_8_ = local_450._0_8_;
  register0x00001308 = auVar68._0_8_;
  local_460 = auVar68._0_8_;
  register0x00001348 = auVar72._0_8_;
  local_470 = auVar72._0_8_;
  register0x00001488 = auVar70._0_8_;
  local_480 = auVar70._0_8_;
  local_490 = auVar71._0_8_;
  register0x000013c8 = local_490;
  local_4b0 = ZEXT416((uint)(auVar50._0_4_ * 9.536743e-07));
  local_1e0 = vbroadcastss_avx512vl(local_4b0);
  auVar50 = vxorps_avx512vl(local_1e0._0_16_,auVar69);
  local_1c0 = auVar50._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uVar42 = 0;
  local_270 = vsubps_avx512vl(auVar52,auVar61);
  local_280 = vsubps_avx(auVar59,auVar52);
  local_290 = vsubps_avx(_local_4a0,auVar59);
  local_3a0 = vsubps_avx512vl(_local_360,local_320);
  local_3b0 = vsubps_avx512vl(_local_370,local_330);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  _local_3d0 = vsubps_avx(_local_390,local_350);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar50 = ZEXT816(0x3f80000000000000);
  auVar278 = ZEXT1664(auVar50);
  do {
    auVar72 = auVar278._0_16_;
    auVar64 = vshufps_avx512vl(auVar72,auVar72,0x50);
    auVar263._8_4_ = 0x3f800000;
    auVar263._0_8_ = &DAT_3f8000003f800000;
    auVar263._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._0_16_ = auVar263;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar51 = vsubps_avx(auVar263,auVar64);
    fVar244 = auVar64._0_4_;
    auVar141._0_4_ = local_460._0_4_ * fVar244;
    fVar227 = auVar64._4_4_;
    auVar141._4_4_ = local_460._4_4_ * fVar227;
    fVar239 = auVar64._8_4_;
    auVar141._8_4_ = local_460._8_4_ * fVar239;
    fVar240 = auVar64._12_4_;
    auVar141._12_4_ = local_460._12_4_ * fVar240;
    auVar155._0_4_ = local_470._0_4_ * fVar244;
    auVar155._4_4_ = local_470._4_4_ * fVar227;
    auVar155._8_4_ = local_470._8_4_ * fVar239;
    auVar155._12_4_ = local_470._12_4_ * fVar240;
    auVar169._0_4_ = local_480._0_4_ * fVar244;
    auVar169._4_4_ = local_480._4_4_ * fVar227;
    auVar169._8_4_ = local_480._8_4_ * fVar239;
    auVar169._12_4_ = local_480._12_4_ * fVar240;
    auVar124._0_4_ = local_490._0_4_ * fVar244;
    auVar124._4_4_ = local_490._4_4_ * fVar227;
    auVar124._8_4_ = local_490._8_4_ * fVar239;
    auVar124._12_4_ = local_490._12_4_ * fVar240;
    auVar62 = vfmadd231ps_avx512vl(auVar141,auVar51,local_420);
    auVar63 = vfmadd231ps_avx512vl(auVar155,auVar51,local_430);
    auVar66 = vfmadd231ps_avx512vl(auVar169,auVar51,local_440);
    auVar64 = vfmadd231ps_fma(auVar124,local_450,auVar51);
    auVar51 = vmovshdup_avx(auVar50);
    fVar227 = auVar50._0_4_;
    fVar244 = (auVar51._0_4_ - fVar227) * 0.04761905;
    auVar148._4_4_ = fVar227;
    auVar148._0_4_ = fVar227;
    auVar148._8_4_ = fVar227;
    auVar148._12_4_ = fVar227;
    auVar148._16_4_ = fVar227;
    auVar148._20_4_ = fVar227;
    auVar148._24_4_ = fVar227;
    auVar148._28_4_ = fVar227;
    auVar84._0_8_ = auVar51._0_8_;
    auVar84._8_8_ = auVar84._0_8_;
    auVar84._16_8_ = auVar84._0_8_;
    auVar84._24_8_ = auVar84._0_8_;
    auVar91 = vsubps_avx(auVar84,auVar148);
    uVar115 = auVar62._0_4_;
    auVar93._4_4_ = uVar115;
    auVar93._0_4_ = uVar115;
    auVar93._8_4_ = uVar115;
    auVar93._12_4_ = uVar115;
    auVar93._16_4_ = uVar115;
    auVar93._20_4_ = uVar115;
    auVar93._24_4_ = uVar115;
    auVar93._28_4_ = uVar115;
    auVar224._8_4_ = 1;
    auVar224._0_8_ = 0x100000001;
    auVar224._12_4_ = 1;
    auVar224._16_4_ = 1;
    auVar224._20_4_ = 1;
    auVar224._24_4_ = 1;
    auVar224._28_4_ = 1;
    auVar89 = ZEXT1632(auVar62);
    auVar87 = vpermps_avx2(auVar224,auVar89);
    auVar73 = vbroadcastss_avx512vl(auVar63);
    auVar90 = ZEXT1632(auVar63);
    auVar74 = vpermps_avx512vl(auVar224,auVar90);
    auVar75 = vbroadcastss_avx512vl(auVar66);
    auVar88 = ZEXT1632(auVar66);
    auVar76 = vpermps_avx512vl(auVar224,auVar88);
    auVar77 = vbroadcastss_avx512vl(auVar64);
    auVar86 = ZEXT1632(auVar64);
    auVar78 = vpermps_avx512vl(auVar224,auVar86);
    auVar225._4_4_ = fVar244;
    auVar225._0_4_ = fVar244;
    auVar225._8_4_ = fVar244;
    auVar225._12_4_ = fVar244;
    auVar225._16_4_ = fVar244;
    auVar225._20_4_ = fVar244;
    auVar225._24_4_ = fVar244;
    auVar225._28_4_ = fVar244;
    auVar85._8_4_ = 2;
    auVar85._0_8_ = 0x200000002;
    auVar85._12_4_ = 2;
    auVar85._16_4_ = 2;
    auVar85._20_4_ = 2;
    auVar85._24_4_ = 2;
    auVar85._28_4_ = 2;
    auVar79 = vpermps_avx512vl(auVar85,auVar89);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar81 = vpermps_avx512vl(auVar80,auVar89);
    auVar89 = vpermps_avx2(auVar85,auVar90);
    auVar82 = vpermps_avx512vl(auVar80,auVar90);
    auVar90 = vpermps_avx2(auVar85,auVar88);
    auVar83 = vpermps_avx512vl(auVar80,auVar88);
    auVar84 = vpermps_avx512vl(auVar85,auVar86);
    auVar85 = vpermps_avx512vl(auVar80,auVar86);
    auVar51 = vfmadd132ps_fma(auVar91,auVar148,_DAT_02020f20);
    auVar91 = vsubps_avx(auVar266,ZEXT1632(auVar51));
    auVar80 = vmulps_avx512vl(auVar73,ZEXT1632(auVar51));
    auVar88 = ZEXT1632(auVar51);
    auVar86 = vmulps_avx512vl(auVar74,auVar88);
    auVar64 = vfmadd231ps_fma(auVar80,auVar91,auVar93);
    auVar62 = vfmadd231ps_fma(auVar86,auVar91,auVar87);
    auVar80 = vmulps_avx512vl(auVar75,auVar88);
    auVar86 = vmulps_avx512vl(auVar76,auVar88);
    auVar73 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar74);
    auVar80 = vmulps_avx512vl(auVar77,auVar88);
    auVar93 = ZEXT1632(auVar51);
    auVar78 = vmulps_avx512vl(auVar78,auVar93);
    auVar75 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar78,auVar91,auVar76);
    fVar239 = auVar51._0_4_;
    fVar240 = auVar51._4_4_;
    auVar78._4_4_ = fVar240 * auVar73._4_4_;
    auVar78._0_4_ = fVar239 * auVar73._0_4_;
    fVar241 = auVar51._8_4_;
    auVar78._8_4_ = fVar241 * auVar73._8_4_;
    fVar242 = auVar51._12_4_;
    auVar78._12_4_ = fVar242 * auVar73._12_4_;
    auVar78._16_4_ = auVar73._16_4_ * 0.0;
    auVar78._20_4_ = auVar73._20_4_ * 0.0;
    auVar78._24_4_ = auVar73._24_4_ * 0.0;
    auVar78._28_4_ = fVar227;
    auVar80._4_4_ = fVar240 * auVar74._4_4_;
    auVar80._0_4_ = fVar239 * auVar74._0_4_;
    auVar80._8_4_ = fVar241 * auVar74._8_4_;
    auVar80._12_4_ = fVar242 * auVar74._12_4_;
    auVar80._16_4_ = auVar74._16_4_ * 0.0;
    auVar80._20_4_ = auVar74._20_4_ * 0.0;
    auVar80._24_4_ = auVar74._24_4_ * 0.0;
    auVar80._28_4_ = auVar87._28_4_;
    auVar64 = vfmadd231ps_fma(auVar78,auVar91,ZEXT1632(auVar64));
    auVar62 = vfmadd231ps_fma(auVar80,auVar91,ZEXT1632(auVar62));
    auVar92._0_4_ = fVar239 * auVar75._0_4_;
    auVar92._4_4_ = fVar240 * auVar75._4_4_;
    auVar92._8_4_ = fVar241 * auVar75._8_4_;
    auVar92._12_4_ = fVar242 * auVar75._12_4_;
    auVar92._16_4_ = auVar75._16_4_ * 0.0;
    auVar92._20_4_ = auVar75._20_4_ * 0.0;
    auVar92._24_4_ = auVar75._24_4_ * 0.0;
    auVar92._28_4_ = 0;
    auVar86._4_4_ = fVar240 * auVar76._4_4_;
    auVar86._0_4_ = fVar239 * auVar76._0_4_;
    auVar86._8_4_ = fVar241 * auVar76._8_4_;
    auVar86._12_4_ = fVar242 * auVar76._12_4_;
    auVar86._16_4_ = auVar76._16_4_ * 0.0;
    auVar86._20_4_ = auVar76._20_4_ * 0.0;
    auVar86._24_4_ = auVar76._24_4_ * 0.0;
    auVar86._28_4_ = auVar75._28_4_;
    auVar63 = vfmadd231ps_fma(auVar92,auVar91,auVar73);
    auVar66 = vfmadd231ps_fma(auVar86,auVar91,auVar74);
    auVar88._28_4_ = auVar74._28_4_;
    auVar88._0_28_ =
         ZEXT1628(CONCAT412(fVar242 * auVar66._12_4_,
                            CONCAT48(fVar241 * auVar66._8_4_,
                                     CONCAT44(fVar240 * auVar66._4_4_,fVar239 * auVar66._0_4_))));
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar63._12_4_,
                                                 CONCAT48(fVar241 * auVar63._8_4_,
                                                          CONCAT44(fVar240 * auVar63._4_4_,
                                                                   fVar239 * auVar63._0_4_)))),
                              auVar91,ZEXT1632(auVar64));
    auVar68 = vfmadd231ps_fma(auVar88,auVar91,ZEXT1632(auVar62));
    auVar87 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar64));
    auVar73 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar62));
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar87 = vmulps_avx512vl(auVar87,auVar74);
    auVar73 = vmulps_avx512vl(auVar73,auVar74);
    auVar159._0_4_ = fVar244 * auVar87._0_4_;
    auVar159._4_4_ = fVar244 * auVar87._4_4_;
    auVar159._8_4_ = fVar244 * auVar87._8_4_;
    auVar159._12_4_ = fVar244 * auVar87._12_4_;
    auVar159._16_4_ = fVar244 * auVar87._16_4_;
    auVar159._20_4_ = fVar244 * auVar87._20_4_;
    auVar159._24_4_ = fVar244 * auVar87._24_4_;
    auVar159._28_4_ = 0;
    auVar87 = vmulps_avx512vl(auVar225,auVar73);
    auVar63 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar68),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar130._0_4_ = auVar159._0_4_ + auVar67._0_4_;
    auVar130._4_4_ = auVar159._4_4_ + auVar67._4_4_;
    auVar130._8_4_ = auVar159._8_4_ + auVar67._8_4_;
    auVar130._12_4_ = auVar159._12_4_ + auVar67._12_4_;
    auVar130._16_4_ = auVar159._16_4_ + 0.0;
    auVar130._20_4_ = auVar159._20_4_ + 0.0;
    auVar130._24_4_ = auVar159._24_4_ + 0.0;
    auVar130._28_4_ = 0;
    auVar92 = ZEXT1632(auVar63);
    auVar76 = vpermt2ps_avx512vl(auVar159,_DAT_0205fd20,auVar92);
    auVar77 = vaddps_avx512vl(ZEXT1632(auVar68),auVar87);
    auVar78 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar92);
    auVar87 = vsubps_avx(auVar73,auVar76);
    auVar76 = vsubps_avx512vl(auVar75,auVar78);
    auVar78 = vmulps_avx512vl(auVar89,auVar93);
    auVar80 = vmulps_avx512vl(auVar82,auVar93);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar81);
    auVar86 = vmulps_avx512vl(auVar90,auVar93);
    auVar88 = vmulps_avx512vl(auVar83,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar89);
    auVar86 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar82);
    auVar88 = vmulps_avx512vl(auVar84,auVar93);
    auVar79 = vmulps_avx512vl(auVar85,auVar93);
    auVar64 = vfmadd231ps_fma(auVar88,auVar91,auVar90);
    auVar62 = vfmadd231ps_fma(auVar79,auVar91,auVar83);
    auVar88 = vmulps_avx512vl(auVar93,auVar89);
    auVar79 = vmulps_avx512vl(ZEXT1632(auVar51),auVar86);
    auVar78 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar78);
    auVar80 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar80);
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar242 * auVar64._12_4_,
                                            CONCAT48(fVar241 * auVar64._8_4_,
                                                     CONCAT44(fVar240 * auVar64._4_4_,
                                                              fVar239 * auVar64._0_4_)))),auVar91,
                         auVar89);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar242 * auVar62._12_4_,
                                            CONCAT48(fVar241 * auVar62._8_4_,
                                                     CONCAT44(fVar240 * auVar62._4_4_,
                                                              fVar239 * auVar62._0_4_)))),auVar91,
                         auVar86);
    auVar79._4_4_ = fVar240 * auVar89._4_4_;
    auVar79._0_4_ = fVar239 * auVar89._0_4_;
    auVar79._8_4_ = fVar241 * auVar89._8_4_;
    auVar79._12_4_ = fVar242 * auVar89._12_4_;
    auVar79._16_4_ = auVar89._16_4_ * 0.0;
    auVar79._20_4_ = auVar89._20_4_ * 0.0;
    auVar79._24_4_ = auVar89._24_4_ * 0.0;
    auVar79._28_4_ = auVar83._28_4_;
    auVar81._4_4_ = fVar240 * auVar86._4_4_;
    auVar81._0_4_ = fVar239 * auVar86._0_4_;
    auVar81._8_4_ = fVar241 * auVar86._8_4_;
    auVar81._12_4_ = fVar242 * auVar86._12_4_;
    auVar81._16_4_ = auVar86._16_4_ * 0.0;
    auVar81._20_4_ = auVar86._20_4_ * 0.0;
    auVar81._24_4_ = auVar86._24_4_ * 0.0;
    auVar81._28_4_ = auVar90._28_4_;
    auVar90 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar78);
    auVar88 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar91);
    auVar91 = vsubps_avx512vl(auVar89,auVar78);
    auVar89 = vsubps_avx512vl(auVar86,auVar80);
    auVar91 = vmulps_avx512vl(auVar91,auVar74);
    auVar89 = vmulps_avx512vl(auVar89,auVar74);
    fVar227 = fVar244 * auVar91._0_4_;
    fVar239 = fVar244 * auVar91._4_4_;
    auVar82._4_4_ = fVar239;
    auVar82._0_4_ = fVar227;
    fVar240 = fVar244 * auVar91._8_4_;
    auVar82._8_4_ = fVar240;
    fVar241 = fVar244 * auVar91._12_4_;
    auVar82._12_4_ = fVar241;
    fVar242 = fVar244 * auVar91._16_4_;
    auVar82._16_4_ = fVar242;
    fVar243 = fVar244 * auVar91._20_4_;
    auVar82._20_4_ = fVar243;
    fVar244 = fVar244 * auVar91._24_4_;
    auVar82._24_4_ = fVar244;
    auVar82._28_4_ = auVar91._28_4_;
    auVar89 = vmulps_avx512vl(auVar225,auVar89);
    auVar74 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,auVar92);
    auVar78 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar92);
    auVar226._0_4_ = auVar90._0_4_ + fVar227;
    auVar226._4_4_ = auVar90._4_4_ + fVar239;
    auVar226._8_4_ = auVar90._8_4_ + fVar240;
    auVar226._12_4_ = auVar90._12_4_ + fVar241;
    auVar226._16_4_ = auVar90._16_4_ + fVar242;
    auVar226._20_4_ = auVar90._20_4_ + fVar243;
    auVar226._24_4_ = auVar90._24_4_ + fVar244;
    auVar226._28_4_ = auVar90._28_4_ + auVar91._28_4_;
    auVar91 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar80 = vaddps_avx512vl(auVar88,auVar89);
    auVar89 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar91 = vsubps_avx(auVar74,auVar91);
    auVar89 = vsubps_avx512vl(auVar78,auVar89);
    auVar148 = ZEXT1632(auVar67);
    auVar86 = vsubps_avx512vl(auVar90,auVar148);
    auVar159 = ZEXT1632(auVar68);
    auVar79 = vsubps_avx512vl(auVar88,auVar159);
    auVar81 = vsubps_avx512vl(auVar74,auVar73);
    auVar86 = vaddps_avx512vl(auVar86,auVar81);
    auVar81 = vsubps_avx512vl(auVar78,auVar75);
    auVar79 = vaddps_avx512vl(auVar79,auVar81);
    auVar81 = vmulps_avx512vl(auVar159,auVar86);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar148,auVar79);
    auVar82 = vmulps_avx512vl(auVar77,auVar86);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar130,auVar79);
    auVar83 = vmulps_avx512vl(auVar76,auVar86);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar87,auVar79);
    auVar84 = vmulps_avx512vl(auVar75,auVar86);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar73,auVar79);
    auVar85 = vmulps_avx512vl(auVar88,auVar86);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar90,auVar79);
    auVar92 = vmulps_avx512vl(auVar80,auVar86);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar226,auVar79);
    auVar93 = vmulps_avx512vl(auVar89,auVar86);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar79);
    auVar86 = vmulps_avx512vl(auVar78,auVar86);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar74,auVar79);
    auVar79 = vminps_avx512vl(auVar81,auVar82);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar79 = vminps_avx512vl(auVar79,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar85,auVar92);
    auVar83 = vmaxps_avx512vl(auVar85,auVar92);
    auVar84 = vminps_avx512vl(auVar93,auVar86);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar79 = vminps_avx512vl(auVar79,auVar82);
    auVar86 = vmaxps_avx512vl(auVar93,auVar86);
    auVar86 = vmaxps_avx512vl(auVar83,auVar86);
    auVar86 = vmaxps_avx512vl(auVar81,auVar86);
    uVar23 = vcmpps_avx512vl(auVar79,local_1e0,2);
    auVar83._4_4_ = uStack_1bc;
    auVar83._0_4_ = local_1c0;
    auVar83._8_4_ = uStack_1b8;
    auVar83._12_4_ = uStack_1b4;
    auVar83._16_4_ = uStack_1b0;
    auVar83._20_4_ = uStack_1ac;
    auVar83._24_4_ = uStack_1a8;
    auVar83._28_4_ = uStack_1a4;
    uVar24 = vcmpps_avx512vl(auVar86,auVar83,5);
    uVar112 = 0;
    bVar40 = (byte)uVar23 & (byte)uVar24 & 0x7f;
    if (bVar40 != 0) {
      auVar86 = vsubps_avx512vl(auVar73,auVar148);
      auVar79 = vsubps_avx512vl(auVar75,auVar159);
      auVar81 = vsubps_avx512vl(auVar74,auVar90);
      auVar86 = vaddps_avx512vl(auVar86,auVar81);
      auVar81 = vsubps_avx512vl(auVar78,auVar88);
      auVar79 = vaddps_avx512vl(auVar79,auVar81);
      auVar81 = vmulps_avx512vl(auVar159,auVar86);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar148);
      auVar77 = vmulps_avx512vl(auVar77,auVar86);
      auVar77 = vfnmadd213ps_avx512vl(auVar130,auVar79,auVar77);
      auVar76 = vmulps_avx512vl(auVar76,auVar86);
      auVar76 = vfnmadd213ps_avx512vl(auVar87,auVar79,auVar76);
      auVar87 = vmulps_avx512vl(auVar75,auVar86);
      auVar75 = vfnmadd231ps_avx512vl(auVar87,auVar79,auVar73);
      auVar87 = vmulps_avx512vl(auVar88,auVar86);
      auVar90 = vfnmadd231ps_avx512vl(auVar87,auVar79,auVar90);
      auVar87 = vmulps_avx512vl(auVar80,auVar86);
      auVar80 = vfnmadd213ps_avx512vl(auVar226,auVar79,auVar87);
      auVar87 = vmulps_avx512vl(auVar89,auVar86);
      auVar88 = vfnmadd213ps_avx512vl(auVar91,auVar79,auVar87);
      auVar91 = vmulps_avx512vl(auVar78,auVar86);
      auVar74 = vfnmadd231ps_avx512vl(auVar91,auVar74,auVar79);
      auVar87 = vminps_avx(auVar81,auVar77);
      auVar91 = vmaxps_avx(auVar81,auVar77);
      auVar73 = vminps_avx(auVar76,auVar75);
      auVar73 = vminps_avx(auVar87,auVar73);
      auVar87 = vmaxps_avx(auVar76,auVar75);
      auVar91 = vmaxps_avx(auVar91,auVar87);
      auVar89 = vminps_avx(auVar90,auVar80);
      auVar87 = vmaxps_avx(auVar90,auVar80);
      auVar90 = vminps_avx(auVar88,auVar74);
      auVar89 = vminps_avx(auVar89,auVar90);
      auVar89 = vminps_avx(auVar73,auVar89);
      auVar73 = vmaxps_avx(auVar88,auVar74);
      auVar87 = vmaxps_avx(auVar87,auVar73);
      auVar91 = vmaxps_avx(auVar91,auVar87);
      uVar23 = vcmpps_avx512vl(auVar91,auVar83,5);
      uVar24 = vcmpps_avx512vl(auVar89,local_1e0,2);
      uVar112 = (uint)(bVar40 & (byte)uVar23 & (byte)uVar24);
    }
    if (uVar112 != 0) {
      auStack_410[uVar42] = uVar112;
      uVar23 = vmovlps_avx(auVar50);
      *(undefined8 *)(&uStack_260 + uVar42 * 2) = uVar23;
      uVar3 = vmovlps_avx(auVar72);
      auStack_1a0[uVar42] = uVar3;
      uVar42 = (ulong)((int)uVar42 + 1);
    }
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar280 = ZEXT1664(auVar50);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar279 = ZEXT3264(auVar91);
    in_ZMM19 = ZEXT464(0x3e2aaaab);
    in_ZMM22 = ZEXT464(0x38d1b717);
    do {
      auVar64 = auVar285._0_16_;
      auVar50 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar51 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar42 == 0) {
        uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar115;
        auVar28._0_4_ = uVar115;
        auVar28._8_4_ = uVar115;
        auVar28._12_4_ = uVar115;
        uVar23 = vcmpps_avx512vl(local_3e0,auVar28,2);
        uVar48 = (uint)uVar49 & (uint)uVar49 + 0xf & (uint)uVar23;
        uVar49 = (ulong)uVar48;
        if (uVar48 == 0) {
          return;
        }
        goto LAB_01c245ec;
      }
      uVar41 = (int)uVar42 - 1;
      uVar43 = (ulong)uVar41;
      uVar112 = (&uStack_260)[uVar43 * 2];
      fVar244 = afStack_25c[uVar43 * 2];
      uVar8 = auStack_410[uVar43];
      uVar3 = auStack_1a0[uVar43];
      auVar278 = ZEXT864(uVar3);
      lVar45 = 0;
      for (uVar47 = (ulong)uVar8; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
        lVar45 = lVar45 + 1;
      }
      uVar46 = uVar8 - 1 & uVar8;
      auStack_410[uVar43] = uVar46;
      if (uVar46 == 0) {
        uVar42 = (ulong)uVar41;
      }
      auVar135._0_4_ = (float)lVar45;
      auVar135._4_8_ = SUB128(ZEXT812(0),4);
      auVar135._12_4_ = 0;
      auVar62 = vmulss_avx512f(auVar135,SUB6416(ZEXT464(0x3e124925),0));
      lVar45 = lVar45 + 1;
      auVar63 = vmulss_avx512f(ZEXT416((uint)(float)lVar45),SUB6416(ZEXT464(0x3e124925),0));
      auVar67 = auVar283._0_16_;
      auVar66 = vsubss_avx512f(auVar67,auVar62);
      auVar62 = vmulss_avx512f(ZEXT416((uint)fVar244),auVar62);
      auVar106._0_16_ = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar112),auVar66);
      auVar62 = vsubss_avx512f(auVar67,auVar63);
      auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * auVar63._0_4_)),ZEXT416(uVar112),auVar62);
      auVar66 = vsubss_avx512f(auVar63,auVar106._0_16_);
      auVar62 = vucomiss_avx512f(auVar66);
      in_ZMM19 = ZEXT1664(auVar62);
      if (uVar8 == 0 || lVar45 == 0) break;
      auVar276._8_8_ = 0;
      auVar276._0_8_ = uVar3;
      auVar62 = vshufps_avx512vl(auVar276,auVar276,0x50);
      vucomiss_avx512f(auVar66);
      uVar112 = (uint)uVar42;
      auVar120 = auVar282._0_16_;
      auVar70 = vsubps_avx512vl(auVar120,auVar62);
      fVar244 = auVar62._0_4_;
      auVar142._0_4_ = fVar244 * (float)local_460._0_4_;
      fVar227 = auVar62._4_4_;
      auVar142._4_4_ = fVar227 * (float)local_460._4_4_;
      fVar239 = auVar62._8_4_;
      auVar142._8_4_ = fVar239 * fStack_458;
      fVar240 = auVar62._12_4_;
      auVar142._12_4_ = fVar240 * fStack_454;
      auVar156._0_4_ = fVar244 * (float)local_470._0_4_;
      auVar156._4_4_ = fVar227 * (float)local_470._4_4_;
      auVar156._8_4_ = fVar239 * fStack_468;
      auVar156._12_4_ = fVar240 * fStack_464;
      auVar170._0_4_ = fVar244 * (float)local_480._0_4_;
      auVar170._4_4_ = fVar227 * (float)local_480._4_4_;
      auVar170._8_4_ = fVar239 * fStack_478;
      auVar170._12_4_ = fVar240 * fStack_474;
      auVar125._0_4_ = fVar244 * (float)local_490._0_4_;
      auVar125._4_4_ = fVar227 * (float)local_490._4_4_;
      auVar125._8_4_ = fVar239 * fStack_488;
      auVar125._12_4_ = fVar240 * fStack_484;
      auVar62 = vfmadd231ps_fma(auVar142,auVar70,local_420);
      auVar68 = vfmadd231ps_fma(auVar156,auVar70,local_430);
      auVar72 = vfmadd231ps_fma(auVar170,auVar70,local_440);
      auVar70 = vfmadd231ps_fma(auVar125,auVar70,local_450);
      auVar138._16_16_ = auVar62;
      auVar138._0_16_ = auVar62;
      auVar149._16_16_ = auVar68;
      auVar149._0_16_ = auVar68;
      auVar160._16_16_ = auVar72;
      auVar160._0_16_ = auVar72;
      auVar62 = vbroadcastss_avx512vl(auVar106._0_16_);
      uVar115 = auVar63._0_4_;
      auVar189._20_4_ = uVar115;
      auVar189._16_4_ = uVar115;
      auVar189._24_4_ = uVar115;
      auVar189._28_4_ = uVar115;
      auVar189._0_16_ = auVar62;
      auVar91 = vsubps_avx(auVar149,auVar138);
      auVar68 = vfmadd213ps_fma(auVar91,auVar189,auVar138);
      auVar91 = vsubps_avx(auVar160,auVar149);
      auVar71 = vfmadd213ps_fma(auVar91,auVar189,auVar149);
      auVar62 = vsubps_avx(auVar70,auVar72);
      auVar150._16_16_ = auVar62;
      auVar150._0_16_ = auVar62;
      auVar62 = vfmadd213ps_fma(auVar150,auVar189,auVar160);
      auVar91 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar68));
      auVar68 = vfmadd213ps_fma(auVar91,auVar189,ZEXT1632(auVar68));
      auVar91 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar71));
      auVar62 = vfmadd213ps_fma(auVar91,auVar189,ZEXT1632(auVar71));
      auVar91 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar68));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar91,auVar189);
      auVar87 = vmulps_avx512vl(auVar91,auVar279._0_32_);
      auVar91._16_16_ = auVar87._16_16_;
      auVar91._0_16_ = vmulss_avx512f(auVar66,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar244 = auVar91._0_4_;
      auVar171._0_8_ =
           CONCAT44(auVar65._4_4_ + fVar244 * auVar87._4_4_,auVar65._0_4_ + fVar244 * auVar87._0_4_)
      ;
      auVar171._8_4_ = auVar65._8_4_ + fVar244 * auVar87._8_4_;
      auVar171._12_4_ = auVar65._12_4_ + fVar244 * auVar87._12_4_;
      auVar143._0_4_ = fVar244 * auVar87._16_4_;
      auVar143._4_4_ = fVar244 * auVar87._20_4_;
      auVar143._8_4_ = fVar244 * auVar87._24_4_;
      auVar143._12_4_ = fVar244 * auVar87._28_4_;
      auVar58 = vsubps_avx((undefined1  [16])0x0,auVar143);
      auVar53 = vshufpd_avx(auVar65,auVar65,3);
      auVar54 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar62 = vsubps_avx(auVar53,auVar65);
      auVar68 = vsubps_avx(auVar54,(undefined1  [16])0x0);
      auVar193._0_4_ = auVar68._0_4_ + auVar62._0_4_;
      auVar193._4_4_ = auVar68._4_4_ + auVar62._4_4_;
      auVar193._8_4_ = auVar68._8_4_ + auVar62._8_4_;
      auVar193._12_4_ = auVar68._12_4_ + auVar62._12_4_;
      auVar62 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar68 = vshufps_avx(auVar171,auVar171,0xb1);
      auVar72 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar70 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar253._4_4_ = auVar193._0_4_;
      auVar253._0_4_ = auVar193._0_4_;
      auVar253._8_4_ = auVar193._0_4_;
      auVar253._12_4_ = auVar193._0_4_;
      auVar71 = vshufps_avx(auVar193,auVar193,0x55);
      fVar244 = auVar71._0_4_;
      auVar209._0_4_ = auVar62._0_4_ * fVar244;
      fVar227 = auVar71._4_4_;
      auVar209._4_4_ = auVar62._4_4_ * fVar227;
      fVar239 = auVar71._8_4_;
      auVar209._8_4_ = auVar62._8_4_ * fVar239;
      fVar240 = auVar71._12_4_;
      auVar209._12_4_ = auVar62._12_4_ * fVar240;
      auVar222._0_4_ = auVar68._0_4_ * fVar244;
      auVar222._4_4_ = auVar68._4_4_ * fVar227;
      auVar222._8_4_ = auVar68._8_4_ * fVar239;
      auVar222._12_4_ = auVar68._12_4_ * fVar240;
      auVar231._0_4_ = auVar72._0_4_ * fVar244;
      auVar231._4_4_ = auVar72._4_4_ * fVar227;
      auVar231._8_4_ = auVar72._8_4_ * fVar239;
      auVar231._12_4_ = auVar72._12_4_ * fVar240;
      auVar194._0_4_ = auVar70._0_4_ * fVar244;
      auVar194._4_4_ = auVar70._4_4_ * fVar227;
      auVar194._8_4_ = auVar70._8_4_ * fVar239;
      auVar194._12_4_ = auVar70._12_4_ * fVar240;
      auVar62 = vfmadd231ps_fma(auVar209,auVar253,auVar65);
      auVar68 = vfmadd231ps_fma(auVar222,auVar253,auVar171);
      auVar71 = vfmadd231ps_fma(auVar231,auVar253,auVar58);
      auVar60 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar253);
      auVar69 = vshufpd_avx(auVar62,auVar62,1);
      auVar55 = vshufpd_avx(auVar68,auVar68,1);
      auVar56 = vshufpd_avx(auVar71,auVar71,1);
      auVar57 = vshufpd_avx(auVar60,auVar60,1);
      auVar72 = vminss_avx(auVar62,auVar68);
      auVar62 = vmaxss_avx(auVar68,auVar62);
      auVar70 = vminss_avx(auVar71,auVar60);
      auVar68 = vmaxss_avx(auVar60,auVar71);
      auVar70 = vminss_avx(auVar72,auVar70);
      auVar62 = vmaxss_avx(auVar68,auVar62);
      auVar71 = vminss_avx(auVar69,auVar55);
      auVar68 = vmaxss_avx(auVar55,auVar69);
      auVar69 = vminss_avx(auVar56,auVar57);
      auVar72 = vmaxss_avx(auVar57,auVar56);
      auVar71 = vminss_avx(auVar71,auVar69);
      auVar68 = vmaxss_avx(auVar72,auVar68);
      auVar72 = vucomiss_avx512f(auVar70);
      in_ZMM22 = ZEXT1664(auVar72);
      if ((uVar112 < 5) || (auVar68 = vucomiss_avx512f(auVar50), uVar112 < 5)) {
        auVar62 = vucomiss_avx512f(auVar50);
        uVar23 = vcmpps_avx512vl(auVar71,auVar51,1);
        uVar24 = vcmpps_avx512vl(auVar70,auVar51,1);
        if ((4 < uVar112 & ((byte)uVar24 | (byte)uVar23)) != 0) goto LAB_01c258ac;
        uVar23 = vcmpps_avx512vl(auVar50,auVar68,5);
        uVar24 = vcmpps_avx512vl(auVar71,auVar51,5);
        if ((((ushort)uVar24 | (ushort)uVar23) & 1) == 0) goto LAB_01c258ac;
        bVar15 = true;
      }
      else {
LAB_01c258ac:
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar3;
        uVar23 = vcmpss_avx512f(auVar70,auVar64,1);
        bVar15 = (bool)((byte)uVar23 & 1);
        iVar113 = auVar283._0_4_;
        fVar244 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar113);
        uVar23 = vcmpss_avx512f(auVar62,auVar64,1);
        bVar15 = (bool)((byte)uVar23 & 1);
        fVar227 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar113);
        bVar15 = fVar244 != fVar227;
        iVar284 = auVar285._0_4_;
        auVar95._16_16_ = auVar91._16_16_;
        auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (uint)bVar15 * iVar284 + (uint)!bVar15 * 0x7f800000;
        auVar51 = auVar94._0_16_;
        auVar97._16_16_ = auVar91._16_16_;
        auVar97._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (uint)bVar15 * iVar284 + (uint)!bVar15 * -0x800000;
        auVar50 = auVar96._0_16_;
        uVar23 = vcmpss_avx512f(auVar71,auVar64,1);
        bVar15 = (bool)((byte)uVar23 & 1);
        fVar239 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar113);
        if ((fVar244 != fVar239) || (NAN(fVar244) || NAN(fVar239))) {
          fVar240 = auVar71._0_4_;
          fVar244 = auVar70._0_4_;
          bVar15 = fVar240 == fVar244;
          if ((!bVar15) || (NAN(fVar240) || NAN(fVar244))) {
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar72 = vxorps_avx512vl(auVar70,auVar27);
            auVar269._0_4_ = auVar72._0_4_ / (fVar240 - fVar244);
            auVar269._4_12_ = auVar72._4_12_;
            auVar72 = vsubss_avx512f(auVar67,auVar269);
            auVar70 = vfmadd213ss_avx512f(auVar72,auVar64,auVar269);
            auVar72 = auVar70;
          }
          else {
            vucomiss_avx512f(auVar64);
            auVar99._16_16_ = auVar91._16_16_;
            auVar99._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar98._4_28_ = auVar99._4_28_;
            auVar98._0_4_ = (uint)bVar15 * iVar284 + (uint)!bVar15 * 0x7f800000;
            auVar70 = auVar98._0_16_;
            auVar72 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar51 = vminss_avx(auVar51,auVar70);
          auVar50 = vmaxss_avx(auVar72,auVar50);
        }
        uVar23 = vcmpss_avx512f(auVar68,auVar64,1);
        bVar15 = (bool)((byte)uVar23 & 1);
        fVar244 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar113);
        if ((fVar227 != fVar244) || (NAN(fVar227) || NAN(fVar244))) {
          fVar240 = auVar68._0_4_;
          fVar227 = auVar62._0_4_;
          bVar15 = fVar240 == fVar227;
          if ((!bVar15) || (NAN(fVar240) || NAN(fVar227))) {
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar62,auVar26);
            auVar232._0_4_ = auVar62._0_4_ / (fVar240 - fVar227);
            auVar232._4_12_ = auVar62._4_12_;
            auVar62 = vsubss_avx512f(auVar67,auVar232);
            auVar68 = vfmadd213ss_avx512f(auVar62,auVar64,auVar232);
            auVar62 = auVar68;
          }
          else {
            vucomiss_avx512f(auVar64);
            auVar101._16_16_ = auVar91._16_16_;
            auVar101._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar100._4_28_ = auVar101._4_28_;
            auVar100._0_4_ = (uint)bVar15 * iVar284 + (uint)!bVar15 * 0x7f800000;
            auVar68 = auVar100._0_16_;
            auVar62 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar51 = vminss_avx(auVar51,auVar68);
          auVar50 = vmaxss_avx(auVar62,auVar50);
        }
        bVar15 = fVar239 != fVar244;
        auVar62 = vminss_avx512f(auVar51,auVar67);
        auVar103._16_16_ = auVar91._16_16_;
        auVar103._0_16_ = auVar51;
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar15 * auVar62._0_4_ + (uint)!bVar15 * auVar51._0_4_;
        auVar51 = vmaxss_avx512f(auVar67,auVar50);
        auVar105._16_16_ = auVar91._16_16_;
        auVar105._0_16_ = auVar50;
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar15 * auVar51._0_4_ + (uint)!bVar15 * auVar50._0_4_;
        auVar50 = vmaxss_avx512f(auVar64,auVar102._0_16_);
        auVar51 = vminss_avx512f(auVar104._0_16_,auVar67);
        bVar15 = true;
        if (auVar51._0_4_ < auVar50._0_4_) {
          auVar278 = ZEXT1664(auVar277);
          auVar106._16_16_ = auVar91._16_16_;
          auVar91 = auVar106;
        }
        else {
          auVar69 = vmaxss_avx512f(auVar64,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
          auVar55 = vminss_avx512f(ZEXT416((uint)(auVar51._0_4_ + 0.1)),auVar67);
          auVar126._0_8_ = auVar65._0_8_;
          auVar126._8_8_ = auVar126._0_8_;
          auVar223._8_8_ = auVar171._0_8_;
          auVar223._0_8_ = auVar171._0_8_;
          auVar233._8_8_ = auVar58._0_8_;
          auVar233._0_8_ = auVar58._0_8_;
          auVar50 = vshufpd_avx(auVar171,auVar171,3);
          auVar51 = vshufpd_avx(auVar58,auVar58,3);
          auVar62 = vshufps_avx(auVar69,auVar55,0);
          auVar71 = vsubps_avx512vl(auVar120,auVar62);
          fVar244 = auVar62._0_4_;
          auVar264._0_4_ = fVar244 * auVar53._0_4_;
          fVar227 = auVar62._4_4_;
          auVar264._4_4_ = fVar227 * auVar53._4_4_;
          fVar239 = auVar62._8_4_;
          auVar264._8_4_ = fVar239 * auVar53._8_4_;
          fVar240 = auVar62._12_4_;
          auVar264._12_4_ = fVar240 * auVar53._12_4_;
          auVar172._0_4_ = fVar244 * auVar50._0_4_;
          auVar172._4_4_ = fVar227 * auVar50._4_4_;
          auVar172._8_4_ = fVar239 * auVar50._8_4_;
          auVar172._12_4_ = fVar240 * auVar50._12_4_;
          auVar186._0_4_ = fVar244 * auVar51._0_4_;
          auVar186._4_4_ = fVar227 * auVar51._4_4_;
          auVar186._8_4_ = fVar239 * auVar51._8_4_;
          auVar186._12_4_ = fVar240 * auVar51._12_4_;
          auVar144._0_4_ = fVar244 * auVar54._0_4_;
          auVar144._4_4_ = fVar227 * auVar54._4_4_;
          auVar144._8_4_ = fVar239 * auVar54._8_4_;
          auVar144._12_4_ = fVar240 * auVar54._12_4_;
          auVar68 = vfmadd231ps_fma(auVar264,auVar71,auVar126);
          auVar72 = vfmadd231ps_fma(auVar172,auVar71,auVar223);
          auVar70 = vfmadd231ps_fma(auVar186,auVar71,auVar233);
          auVar71 = vfmadd231ps_fma(auVar144,auVar71,ZEXT816(0));
          auVar50 = vsubss_avx512f(auVar67,auVar69);
          auVar51 = vmovshdup_avx512vl(auVar277);
          auVar57 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar69._0_4_)),auVar277,
                                        auVar50);
          auVar50 = vsubss_avx512f(auVar67,auVar55);
          auVar58 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar51._0_4_)),auVar277,
                                        auVar50);
          auVar69 = vdivss_avx512f(auVar67,auVar66);
          auVar50 = vsubps_avx(auVar72,auVar68);
          auVar65 = auVar280._0_16_;
          auVar62 = vmulps_avx512vl(auVar50,auVar65);
          auVar50 = vsubps_avx(auVar70,auVar72);
          auVar66 = vmulps_avx512vl(auVar50,auVar65);
          auVar50 = vsubps_avx(auVar71,auVar70);
          auVar50 = vmulps_avx512vl(auVar50,auVar65);
          auVar51 = vminps_avx(auVar66,auVar50);
          auVar50 = vmaxps_avx(auVar66,auVar50);
          auVar51 = vminps_avx(auVar62,auVar51);
          auVar50 = vmaxps_avx(auVar62,auVar50);
          auVar62 = vshufpd_avx(auVar51,auVar51,3);
          auVar66 = vshufpd_avx(auVar50,auVar50,3);
          auVar51 = vminps_avx(auVar51,auVar62);
          auVar50 = vmaxps_avx(auVar50,auVar66);
          fVar244 = auVar69._0_4_;
          auVar210._0_4_ = fVar244 * auVar51._0_4_;
          auVar210._4_4_ = fVar244 * auVar51._4_4_;
          auVar210._8_4_ = fVar244 * auVar51._8_4_;
          auVar210._12_4_ = fVar244 * auVar51._12_4_;
          auVar195._0_4_ = fVar244 * auVar50._0_4_;
          auVar195._4_4_ = fVar244 * auVar50._4_4_;
          auVar195._8_4_ = fVar244 * auVar50._8_4_;
          auVar195._12_4_ = fVar244 * auVar50._12_4_;
          auVar69 = vdivss_avx512f(auVar67,ZEXT416((uint)(auVar58._0_4_ - auVar57._0_4_)));
          auVar50 = vshufpd_avx(auVar68,auVar68,3);
          auVar51 = vshufpd_avx(auVar72,auVar72,3);
          auVar62 = vshufpd_avx(auVar70,auVar70,3);
          auVar66 = vshufpd_avx(auVar71,auVar71,3);
          auVar50 = vsubps_avx(auVar50,auVar68);
          auVar68 = vsubps_avx(auVar51,auVar72);
          auVar72 = vsubps_avx(auVar62,auVar70);
          auVar66 = vsubps_avx(auVar66,auVar71);
          auVar51 = vminps_avx(auVar50,auVar68);
          auVar50 = vmaxps_avx(auVar50,auVar68);
          auVar62 = vminps_avx(auVar72,auVar66);
          auVar62 = vminps_avx(auVar51,auVar62);
          auVar51 = vmaxps_avx(auVar72,auVar66);
          auVar50 = vmaxps_avx(auVar50,auVar51);
          fVar244 = auVar69._0_4_;
          auVar234._0_4_ = fVar244 * auVar62._0_4_;
          auVar234._4_4_ = fVar244 * auVar62._4_4_;
          auVar234._8_4_ = fVar244 * auVar62._8_4_;
          auVar234._12_4_ = fVar244 * auVar62._12_4_;
          auVar246._0_4_ = fVar244 * auVar50._0_4_;
          auVar246._4_4_ = fVar244 * auVar50._4_4_;
          auVar246._8_4_ = fVar244 * auVar50._8_4_;
          auVar246._12_4_ = fVar244 * auVar50._12_4_;
          auVar56 = vinsertps_avx512f(auVar106._0_16_,auVar57,0x10);
          auVar68 = vinsertps_avx(auVar63,auVar58,0x10);
          auVar119._0_4_ = auVar56._0_4_ + auVar68._0_4_;
          auVar119._4_4_ = auVar56._4_4_ + auVar68._4_4_;
          auVar119._8_4_ = auVar56._8_4_ + auVar68._8_4_;
          auVar119._12_4_ = auVar56._12_4_ + auVar68._12_4_;
          auVar25._8_4_ = 0x3f000000;
          auVar25._0_8_ = 0x3f0000003f000000;
          auVar25._12_4_ = 0x3f000000;
          auVar54 = vmulps_avx512vl(auVar119,auVar25);
          auVar62 = vshufps_avx(auVar54,auVar54,0x54);
          uVar115 = auVar54._0_4_;
          auVar136._4_4_ = uVar115;
          auVar136._0_4_ = uVar115;
          auVar136._8_4_ = uVar115;
          auVar136._12_4_ = uVar115;
          auVar51 = vfmadd213ps_fma(local_270,auVar136,auVar61);
          auVar66 = vfmadd213ps_fma(local_280,auVar136,auVar52);
          auVar72 = vfmadd213ps_avx512vl(local_290,auVar136,auVar59);
          auVar50 = vsubps_avx(auVar66,auVar51);
          auVar51 = vfmadd213ps_fma(auVar50,auVar136,auVar51);
          auVar50 = vsubps_avx(auVar72,auVar66);
          auVar50 = vfmadd213ps_fma(auVar50,auVar136,auVar66);
          auVar50 = vsubps_avx(auVar50,auVar51);
          auVar51 = vfmadd231ps_fma(auVar51,auVar50,auVar136);
          auVar70 = vmulps_avx512vl(auVar50,auVar65);
          auVar254._8_8_ = auVar51._0_8_;
          auVar254._0_8_ = auVar51._0_8_;
          auVar50 = vshufpd_avx(auVar51,auVar51,3);
          auVar51 = vshufps_avx(auVar54,auVar54,0x55);
          auVar66 = vsubps_avx(auVar50,auVar254);
          auVar72 = vfmadd231ps_fma(auVar254,auVar51,auVar66);
          auVar270._8_8_ = auVar70._0_8_;
          auVar270._0_8_ = auVar70._0_8_;
          auVar50 = vshufpd_avx(auVar70,auVar70,3);
          auVar50 = vsubps_avx(auVar50,auVar270);
          auVar51 = vfmadd213ps_fma(auVar50,auVar51,auVar270);
          auVar137._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
          auVar137._8_4_ = auVar66._8_4_ ^ 0x80000000;
          auVar137._12_4_ = auVar66._12_4_ ^ 0x80000000;
          auVar50 = vmovshdup_avx(auVar51);
          auVar271._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
          auVar271._8_4_ = auVar50._8_4_ ^ 0x80000000;
          auVar271._12_4_ = auVar50._12_4_ ^ 0x80000000;
          auVar70 = vmovshdup_avx512vl(auVar66);
          auVar71 = vpermt2ps_avx512vl(auVar271,ZEXT416(5),auVar66);
          auVar50 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar50._0_4_ * auVar66._0_4_)),auVar51,
                                        auVar70);
          auVar51 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar137);
          auVar145._0_4_ = auVar50._0_4_;
          auVar145._4_4_ = auVar145._0_4_;
          auVar145._8_4_ = auVar145._0_4_;
          auVar145._12_4_ = auVar145._0_4_;
          auVar50 = vdivps_avx(auVar71,auVar145);
          auVar51 = vdivps_avx(auVar51,auVar145);
          fVar227 = auVar72._0_4_;
          auVar66 = vshufps_avx(auVar72,auVar72,0x55);
          fVar244 = auVar51._0_4_;
          auVar255._0_4_ = fVar227 * auVar50._0_4_ + auVar66._0_4_ * fVar244;
          auVar255._4_4_ = fVar227 * auVar50._4_4_ + auVar66._4_4_ * auVar51._4_4_;
          auVar255._8_4_ = fVar227 * auVar50._8_4_ + auVar66._8_4_ * auVar51._8_4_;
          auVar255._12_4_ = fVar227 * auVar50._12_4_ + auVar66._12_4_ * auVar51._12_4_;
          auVar55 = vsubps_avx(auVar62,auVar255);
          auVar72 = vmovshdup_avx(auVar50);
          auVar62 = vinsertps_avx(auVar210,auVar234,0x1c);
          auVar272._0_4_ = auVar72._0_4_ * auVar62._0_4_;
          auVar272._4_4_ = auVar72._4_4_ * auVar62._4_4_;
          auVar272._8_4_ = auVar72._8_4_ * auVar62._8_4_;
          auVar272._12_4_ = auVar72._12_4_ * auVar62._12_4_;
          auVar66 = vinsertps_avx(auVar195,auVar246,0x1c);
          auVar256._0_4_ = auVar72._0_4_ * auVar66._0_4_;
          auVar256._4_4_ = auVar72._4_4_ * auVar66._4_4_;
          auVar256._8_4_ = auVar72._8_4_ * auVar66._8_4_;
          auVar256._12_4_ = auVar72._12_4_ * auVar66._12_4_;
          auVar53 = vminps_avx512vl(auVar272,auVar256);
          auVar71 = vmaxps_avx(auVar256,auVar272);
          auVar69 = vmovshdup_avx(auVar51);
          auVar72 = vinsertps_avx(auVar234,auVar210,0x4c);
          auVar235._0_4_ = auVar69._0_4_ * auVar72._0_4_;
          auVar235._4_4_ = auVar69._4_4_ * auVar72._4_4_;
          auVar235._8_4_ = auVar69._8_4_ * auVar72._8_4_;
          auVar235._12_4_ = auVar69._12_4_ * auVar72._12_4_;
          auVar70 = vinsertps_avx(auVar246,auVar195,0x4c);
          auVar247._0_4_ = auVar69._0_4_ * auVar70._0_4_;
          auVar247._4_4_ = auVar69._4_4_ * auVar70._4_4_;
          auVar247._8_4_ = auVar69._8_4_ * auVar70._8_4_;
          auVar247._12_4_ = auVar69._12_4_ * auVar70._12_4_;
          auVar69 = vminps_avx(auVar235,auVar247);
          auVar53 = vaddps_avx512vl(auVar53,auVar69);
          auVar69 = vmaxps_avx(auVar247,auVar235);
          auVar236._0_4_ = auVar71._0_4_ + auVar69._0_4_;
          auVar236._4_4_ = auVar71._4_4_ + auVar69._4_4_;
          auVar236._8_4_ = auVar71._8_4_ + auVar69._8_4_;
          auVar236._12_4_ = auVar71._12_4_ + auVar69._12_4_;
          auVar248._8_8_ = 0x3f80000000000000;
          auVar248._0_8_ = 0x3f80000000000000;
          auVar71 = vsubps_avx(auVar248,auVar236);
          auVar69 = vsubps_avx(auVar248,auVar53);
          auVar53 = vsubps_avx(auVar56,auVar54);
          auVar54 = vsubps_avx(auVar68,auVar54);
          fVar242 = auVar53._0_4_;
          auVar273._0_4_ = fVar242 * auVar71._0_4_;
          fVar243 = auVar53._4_4_;
          auVar273._4_4_ = fVar243 * auVar71._4_4_;
          fVar201 = auVar53._8_4_;
          auVar273._8_4_ = fVar201 * auVar71._8_4_;
          fVar218 = auVar53._12_4_;
          auVar273._12_4_ = fVar218 * auVar71._12_4_;
          auVar60 = vbroadcastss_avx512vl(auVar50);
          auVar62 = vmulps_avx512vl(auVar60,auVar62);
          auVar66 = vmulps_avx512vl(auVar60,auVar66);
          auVar60 = vminps_avx512vl(auVar62,auVar66);
          auVar62 = vmaxps_avx(auVar66,auVar62);
          auVar211._0_4_ = fVar244 * auVar72._0_4_;
          auVar211._4_4_ = fVar244 * auVar72._4_4_;
          auVar211._8_4_ = fVar244 * auVar72._8_4_;
          auVar211._12_4_ = fVar244 * auVar72._12_4_;
          auVar196._0_4_ = fVar244 * auVar70._0_4_;
          auVar196._4_4_ = fVar244 * auVar70._4_4_;
          auVar196._8_4_ = fVar244 * auVar70._8_4_;
          auVar196._12_4_ = fVar244 * auVar70._12_4_;
          auVar66 = vminps_avx(auVar211,auVar196);
          auVar72 = vaddps_avx512vl(auVar60,auVar66);
          auVar70 = vmulps_avx512vl(auVar53,auVar69);
          fVar227 = auVar54._0_4_;
          auVar237._0_4_ = fVar227 * auVar71._0_4_;
          fVar239 = auVar54._4_4_;
          auVar237._4_4_ = fVar239 * auVar71._4_4_;
          fVar240 = auVar54._8_4_;
          auVar237._8_4_ = fVar240 * auVar71._8_4_;
          fVar241 = auVar54._12_4_;
          auVar237._12_4_ = fVar241 * auVar71._12_4_;
          auVar249._0_4_ = fVar227 * auVar69._0_4_;
          auVar249._4_4_ = fVar239 * auVar69._4_4_;
          auVar249._8_4_ = fVar240 * auVar69._8_4_;
          auVar249._12_4_ = fVar241 * auVar69._12_4_;
          auVar66 = vmaxps_avx(auVar196,auVar211);
          auVar197._0_4_ = auVar62._0_4_ + auVar66._0_4_;
          auVar197._4_4_ = auVar62._4_4_ + auVar66._4_4_;
          auVar197._8_4_ = auVar62._8_4_ + auVar66._8_4_;
          auVar197._12_4_ = auVar62._12_4_ + auVar66._12_4_;
          auVar212._8_8_ = 0x3f800000;
          auVar212._0_8_ = 0x3f800000;
          auVar62 = vsubps_avx(auVar212,auVar197);
          auVar66 = vsubps_avx(auVar212,auVar72);
          auVar265._0_4_ = fVar242 * auVar62._0_4_;
          auVar265._4_4_ = fVar243 * auVar62._4_4_;
          auVar265._8_4_ = fVar201 * auVar62._8_4_;
          auVar265._12_4_ = fVar218 * auVar62._12_4_;
          auVar257._0_4_ = fVar242 * auVar66._0_4_;
          auVar257._4_4_ = fVar243 * auVar66._4_4_;
          auVar257._8_4_ = fVar201 * auVar66._8_4_;
          auVar257._12_4_ = fVar218 * auVar66._12_4_;
          auVar198._0_4_ = fVar227 * auVar62._0_4_;
          auVar198._4_4_ = fVar239 * auVar62._4_4_;
          auVar198._8_4_ = fVar240 * auVar62._8_4_;
          auVar198._12_4_ = fVar241 * auVar62._12_4_;
          auVar213._0_4_ = fVar227 * auVar66._0_4_;
          auVar213._4_4_ = fVar239 * auVar66._4_4_;
          auVar213._8_4_ = fVar240 * auVar66._8_4_;
          auVar213._12_4_ = fVar241 * auVar66._12_4_;
          auVar62 = vminps_avx(auVar265,auVar257);
          auVar66 = vminps_avx(auVar198,auVar213);
          auVar72 = vminps_avx(auVar62,auVar66);
          auVar62 = vmaxps_avx(auVar257,auVar265);
          auVar66 = vmaxps_avx(auVar213,auVar198);
          auVar66 = vmaxps_avx(auVar66,auVar62);
          auVar71 = vminps_avx512vl(auVar273,auVar70);
          auVar62 = vminps_avx(auVar237,auVar249);
          auVar62 = vminps_avx(auVar71,auVar62);
          auVar62 = vhaddps_avx(auVar72,auVar62);
          auVar70 = vmaxps_avx512vl(auVar70,auVar273);
          auVar72 = vmaxps_avx(auVar249,auVar237);
          auVar72 = vmaxps_avx(auVar72,auVar70);
          auVar66 = vhaddps_avx(auVar66,auVar72);
          auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
          auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
          auVar199._0_4_ = auVar62._0_4_ + auVar55._0_4_;
          auVar199._4_4_ = auVar62._4_4_ + auVar55._4_4_;
          auVar199._8_4_ = auVar62._8_4_ + auVar55._8_4_;
          auVar199._12_4_ = auVar62._12_4_ + auVar55._12_4_;
          auVar214._0_4_ = auVar66._0_4_ + auVar55._0_4_;
          auVar214._4_4_ = auVar66._4_4_ + auVar55._4_4_;
          auVar214._8_4_ = auVar66._8_4_ + auVar55._8_4_;
          auVar214._12_4_ = auVar66._12_4_ + auVar55._12_4_;
          auVar62 = vmaxps_avx(auVar56,auVar199);
          auVar66 = vminps_avx(auVar214,auVar68);
          uVar3 = vcmpps_avx512vl(auVar66,auVar62,1);
          auVar62 = vinsertps_avx512f(auVar57,auVar58,0x10);
          auVar278 = ZEXT1664(auVar62);
          if ((uVar3 & 3) == 0) {
            vucomiss_avx512f(auVar106._0_16_);
            auVar282 = ZEXT1664(auVar120);
            auVar91._0_16_ = auVar61;
            if (uVar112 < 4 && (uVar8 == 0 || lVar45 == 0)) {
              bVar15 = false;
            }
            else {
              lVar45 = 200;
              do {
                auVar66 = vsubss_avx512f(auVar67,auVar55);
                fVar240 = auVar66._0_4_;
                fVar227 = fVar240 * fVar240 * fVar240;
                fVar241 = auVar55._0_4_;
                fVar239 = fVar241 * 3.0 * fVar240 * fVar240;
                fVar240 = fVar240 * fVar241 * fVar241 * 3.0;
                auVar173._4_4_ = fVar227;
                auVar173._0_4_ = fVar227;
                auVar173._8_4_ = fVar227;
                auVar173._12_4_ = fVar227;
                auVar157._4_4_ = fVar239;
                auVar157._0_4_ = fVar239;
                auVar157._8_4_ = fVar239;
                auVar157._12_4_ = fVar239;
                auVar127._4_4_ = fVar240;
                auVar127._0_4_ = fVar240;
                auVar127._8_4_ = fVar240;
                auVar127._12_4_ = fVar240;
                fVar241 = fVar241 * fVar241 * fVar241;
                auVar187._0_4_ = (float)local_4a0._0_4_ * fVar241;
                auVar187._4_4_ = (float)local_4a0._4_4_ * fVar241;
                auVar187._8_4_ = fStack_498 * fVar241;
                auVar187._12_4_ = fStack_494 * fVar241;
                auVar66 = vfmadd231ps_fma(auVar187,auVar59,auVar127);
                auVar66 = vfmadd231ps_fma(auVar66,auVar52,auVar157);
                auVar66 = vfmadd231ps_avx512vl(auVar66,auVar61,auVar173);
                auVar128._8_8_ = auVar66._0_8_;
                auVar128._0_8_ = auVar66._0_8_;
                auVar66 = vshufpd_avx(auVar66,auVar66,3);
                auVar68 = vshufps_avx(auVar55,auVar55,0x55);
                auVar66 = vsubps_avx(auVar66,auVar128);
                auVar68 = vfmadd213ps_fma(auVar66,auVar68,auVar128);
                fVar227 = auVar68._0_4_;
                auVar66 = vshufps_avx(auVar68,auVar68,0x55);
                auVar129._0_4_ = auVar50._0_4_ * fVar227 + fVar244 * auVar66._0_4_;
                auVar129._4_4_ = auVar50._4_4_ * fVar227 + auVar51._4_4_ * auVar66._4_4_;
                auVar129._8_4_ = auVar50._8_4_ * fVar227 + auVar51._8_4_ * auVar66._8_4_;
                auVar129._12_4_ = auVar50._12_4_ * fVar227 + auVar51._12_4_ * auVar66._12_4_;
                auVar55 = vsubps_avx(auVar55,auVar129);
                auVar66 = vandps_avx512vl(auVar68,auVar281._0_16_);
                auVar91._0_16_ = vprolq_avx512vl(auVar66,0x20);
                auVar66 = vmaxss_avx(auVar91._0_16_,auVar66);
                bVar22 = auVar66._0_4_ <= (float)local_4b0._0_4_;
                if (auVar66._0_4_ < (float)local_4b0._0_4_) {
                  auVar50 = vucomiss_avx512f(auVar64);
                  if (bVar22) {
                    auVar51 = vucomiss_avx512f(auVar50);
                    auVar283 = ZEXT1664(auVar51);
                    if (bVar22) {
                      vmovshdup_avx(auVar50);
                      auVar51 = vucomiss_avx512f(auVar64);
                      if (bVar22) {
                        auVar66 = vucomiss_avx512f(auVar51);
                        auVar283 = ZEXT1664(auVar66);
                        if (bVar22) {
                          auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar54 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar67 = vdpps_avx(auVar54,local_2a0,0x7f);
                          auVar68 = vdpps_avx(auVar54,local_2b0,0x7f);
                          auVar72 = vdpps_avx(auVar54,local_2c0,0x7f);
                          auVar70 = vdpps_avx(auVar54,local_2d0,0x7f);
                          auVar71 = vdpps_avx(auVar54,local_2e0,0x7f);
                          auVar69 = vdpps_avx(auVar54,local_2f0,0x7f);
                          auVar53 = vdpps_avx(auVar54,local_300,0x7f);
                          auVar54 = vdpps_avx(auVar54,local_310,0x7f);
                          auVar55 = vsubss_avx512f(auVar66,auVar51);
                          fVar240 = auVar51._0_4_;
                          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar71._0_4_)),auVar55
                                                    ,auVar67);
                          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * fVar240)),auVar55
                                                    ,auVar68);
                          auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar240)),auVar55
                                                    ,auVar72);
                          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar54._0_4_)),auVar55
                                                    ,auVar70);
                          auVar91._0_16_ = vsubss_avx512f(auVar66,auVar50);
                          auVar200._0_4_ = auVar91._0_4_;
                          fVar244 = auVar200._0_4_ * auVar200._0_4_ * auVar200._0_4_;
                          local_120 = auVar50._0_4_;
                          fVar227 = local_120 * 3.0 * auVar200._0_4_ * auVar200._0_4_;
                          fVar239 = auVar200._0_4_ * local_120 * local_120 * 3.0;
                          fVar242 = local_120 * local_120 * local_120;
                          auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar72._0_4_)),
                                                    ZEXT416((uint)fVar239),auVar68);
                          auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar227),auVar67);
                          auVar51 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar244),auVar51);
                          fVar241 = auVar51._0_4_;
                          if ((fVar114 <= fVar241) &&
                             (fVar243 = *(float *)(ray + k * 4 + 0x100), fVar241 <= fVar243)) {
                            auVar51 = vshufps_avx(auVar50,auVar50,0x55);
                            auVar68 = vsubps_avx512vl(auVar120,auVar51);
                            fVar201 = auVar51._0_4_;
                            auVar238._0_4_ = fVar201 * (float)local_360._0_4_;
                            fVar218 = auVar51._4_4_;
                            auVar238._4_4_ = fVar218 * (float)local_360._4_4_;
                            fVar219 = auVar51._8_4_;
                            auVar238._8_4_ = fVar219 * fStack_358;
                            fVar220 = auVar51._12_4_;
                            auVar238._12_4_ = fVar220 * fStack_354;
                            auVar250._0_4_ = fVar201 * (float)local_370._0_4_;
                            auVar250._4_4_ = fVar218 * (float)local_370._4_4_;
                            auVar250._8_4_ = fVar219 * fStack_368;
                            auVar250._12_4_ = fVar220 * fStack_364;
                            auVar258._0_4_ = fVar201 * (float)local_380._0_4_;
                            auVar258._4_4_ = fVar218 * (float)local_380._4_4_;
                            auVar258._8_4_ = fVar219 * fStack_378;
                            auVar258._12_4_ = fVar220 * fStack_374;
                            auVar215._0_4_ = fVar201 * (float)local_390._0_4_;
                            auVar215._4_4_ = fVar218 * (float)local_390._4_4_;
                            auVar215._8_4_ = fVar219 * fStack_388;
                            auVar215._12_4_ = fVar220 * fStack_384;
                            auVar51 = vfmadd231ps_fma(auVar238,auVar68,local_320);
                            auVar66 = vfmadd231ps_fma(auVar250,auVar68,local_330);
                            auVar67 = vfmadd231ps_fma(auVar258,auVar68,local_340);
                            auVar68 = vfmadd231ps_fma(auVar215,auVar68,local_350);
                            auVar51 = vsubps_avx(auVar66,auVar51);
                            auVar66 = vsubps_avx(auVar67,auVar66);
                            auVar67 = vsubps_avx(auVar68,auVar67);
                            auVar259._0_4_ = local_120 * auVar66._0_4_;
                            auVar259._4_4_ = local_120 * auVar66._4_4_;
                            auVar259._8_4_ = local_120 * auVar66._8_4_;
                            auVar259._12_4_ = local_120 * auVar66._12_4_;
                            auVar200._4_4_ = auVar200._0_4_;
                            auVar200._8_4_ = auVar200._0_4_;
                            auVar200._12_4_ = auVar200._0_4_;
                            auVar51 = vfmadd231ps_fma(auVar259,auVar200,auVar51);
                            auVar216._0_4_ = local_120 * auVar67._0_4_;
                            auVar216._4_4_ = local_120 * auVar67._4_4_;
                            auVar216._8_4_ = local_120 * auVar67._8_4_;
                            auVar216._12_4_ = local_120 * auVar67._12_4_;
                            auVar66 = vfmadd231ps_fma(auVar216,auVar200,auVar66);
                            auVar217._0_4_ = local_120 * auVar66._0_4_;
                            auVar217._4_4_ = local_120 * auVar66._4_4_;
                            auVar217._8_4_ = local_120 * auVar66._8_4_;
                            auVar217._12_4_ = local_120 * auVar66._12_4_;
                            auVar51 = vfmadd231ps_fma(auVar217,auVar200,auVar51);
                            auVar91._0_16_ = vmulps_avx512vl(auVar51,auVar65);
                            pGVar9 = (context->scene->geometries).items[uVar48].ptr;
                            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar188._0_4_ = fVar242 * (float)local_3d0._0_4_;
                              auVar188._4_4_ = fVar242 * (float)local_3d0._4_4_;
                              auVar188._8_4_ = fVar242 * fStack_3c8;
                              auVar188._12_4_ = fVar242 * fStack_3c4;
                              auVar174._4_4_ = fVar239;
                              auVar174._0_4_ = fVar239;
                              auVar174._8_4_ = fVar239;
                              auVar174._12_4_ = fVar239;
                              auVar51 = vfmadd132ps_fma(auVar174,auVar188,local_3c0);
                              auVar158._4_4_ = fVar227;
                              auVar158._0_4_ = fVar227;
                              auVar158._8_4_ = fVar227;
                              auVar158._12_4_ = fVar227;
                              auVar51 = vfmadd132ps_fma(auVar158,auVar51,local_3b0);
                              auVar146._4_4_ = fVar244;
                              auVar146._0_4_ = fVar244;
                              auVar146._8_4_ = fVar244;
                              auVar146._12_4_ = fVar244;
                              auVar67 = vfmadd132ps_fma(auVar146,auVar51,local_3a0);
                              auVar51 = vshufps_avx(auVar67,auVar67,0xc9);
                              auVar66 = vshufps_avx(auVar91._0_16_,auVar91._0_16_,0xc9);
                              auVar147._0_4_ = auVar67._0_4_ * auVar66._0_4_;
                              auVar147._4_4_ = auVar67._4_4_ * auVar66._4_4_;
                              auVar147._8_4_ = auVar67._8_4_ * auVar66._8_4_;
                              auVar147._12_4_ = auVar67._12_4_ * auVar66._12_4_;
                              auVar51 = vfmsub231ps_fma(auVar147,auVar91._0_16_,auVar51);
                              local_140 = auVar51._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar241;
                                uVar115 = vextractps_avx(auVar51,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar115;
                                uVar115 = vextractps_avx(auVar51,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar115;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar240;
                                *(uint *)(ray + k * 4 + 0x220) = uVar7;
                                *(uint *)(ray + k * 4 + 0x240) = uVar48;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar161._8_4_ = 1;
                                auVar161._0_8_ = 0x100000001;
                                auVar161._12_4_ = 1;
                                auVar161._16_4_ = 1;
                                auVar161._20_4_ = 1;
                                auVar161._24_4_ = 1;
                                auVar161._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar161,ZEXT1632(auVar50));
                                auVar87 = vpermps_avx2(auVar161,ZEXT1632(auVar51));
                                auVar175._8_4_ = 2;
                                auVar175._0_8_ = 0x200000002;
                                auVar175._12_4_ = 2;
                                auVar175._16_4_ = 2;
                                auVar175._20_4_ = 2;
                                auVar175._24_4_ = 2;
                                auVar175._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar175,ZEXT1632(auVar51));
                                local_180[0] = (RTCHitN)auVar87[0];
                                local_180[1] = (RTCHitN)auVar87[1];
                                local_180[2] = (RTCHitN)auVar87[2];
                                local_180[3] = (RTCHitN)auVar87[3];
                                local_180[4] = (RTCHitN)auVar87[4];
                                local_180[5] = (RTCHitN)auVar87[5];
                                local_180[6] = (RTCHitN)auVar87[6];
                                local_180[7] = (RTCHitN)auVar87[7];
                                local_180[8] = (RTCHitN)auVar87[8];
                                local_180[9] = (RTCHitN)auVar87[9];
                                local_180[10] = (RTCHitN)auVar87[10];
                                local_180[0xb] = (RTCHitN)auVar87[0xb];
                                local_180[0xc] = (RTCHitN)auVar87[0xc];
                                local_180[0xd] = (RTCHitN)auVar87[0xd];
                                local_180[0xe] = (RTCHitN)auVar87[0xe];
                                local_180[0xf] = (RTCHitN)auVar87[0xf];
                                local_180[0x10] = (RTCHitN)auVar87[0x10];
                                local_180[0x11] = (RTCHitN)auVar87[0x11];
                                local_180[0x12] = (RTCHitN)auVar87[0x12];
                                local_180[0x13] = (RTCHitN)auVar87[0x13];
                                local_180[0x14] = (RTCHitN)auVar87[0x14];
                                local_180[0x15] = (RTCHitN)auVar87[0x15];
                                local_180[0x16] = (RTCHitN)auVar87[0x16];
                                local_180[0x17] = (RTCHitN)auVar87[0x17];
                                local_180[0x18] = (RTCHitN)auVar87[0x18];
                                local_180[0x19] = (RTCHitN)auVar87[0x19];
                                local_180[0x1a] = (RTCHitN)auVar87[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar87[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar87[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar87[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar87[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar87[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_220._0_8_;
                                uStack_d8 = local_220._8_8_;
                                uStack_d0 = local_220._16_8_;
                                uStack_c8 = local_220._24_8_;
                                local_c0 = local_200;
                                vpcmpeqd_avx2(local_200,local_200);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar241;
                                local_400 = local_240._0_8_;
                                uStack_3f8 = local_240._8_8_;
                                uStack_3f0 = local_240._16_8_;
                                uStack_3e8 = local_240._24_8_;
                                local_4e0.valid = (int *)&local_400;
                                local_4e0.geometryUserPtr = pGVar9->userPtr;
                                local_4e0.context = context->user;
                                local_4e0.hit = local_180;
                                local_4e0.N = 8;
                                local_4e0.ray = (RTCRayN *)ray;
                                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar9->intersectionFilterN)(&local_4e0);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  in_ZMM19 = ZEXT464(0x3e2aaaab);
                                  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar279 = ZEXT3264(auVar91);
                                  auVar283 = ZEXT464(0x3f800000);
                                  auVar50 = vxorps_avx512vl(auVar64,auVar64);
                                  auVar285 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar281 = ZEXT1664(auVar50);
                                }
                                auVar50 = auVar285._0_16_;
                                auVar38._8_8_ = uStack_3f8;
                                auVar38._0_8_ = local_400;
                                auVar38._16_8_ = uStack_3f0;
                                auVar38._24_8_ = uStack_3e8;
                                if (auVar38 == (undefined1  [32])0x0) {
LAB_01c26635:
                                  *(float *)(ray + k * 4 + 0x100) = fVar243;
                                }
                                else {
                                  p_Var14 = context->args->filter;
                                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var14)(&local_4e0);
                                    in_ZMM22 = ZEXT464(0x38d1b717);
                                    in_ZMM19 = ZEXT464(0x3e2aaaab);
                                    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar279 = ZEXT3264(auVar91);
                                    auVar283 = ZEXT464(0x3f800000);
                                    auVar50 = vxorps_avx512vl(auVar50,auVar50);
                                    auVar285 = ZEXT1664(auVar50);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar281 = ZEXT1664(auVar50);
                                  }
                                  auVar39._8_8_ = uStack_3f8;
                                  auVar39._0_8_ = local_400;
                                  auVar39._16_8_ = uStack_3f0;
                                  auVar39._24_8_ = uStack_3e8;
                                  if (auVar39 == (undefined1  [32])0x0) goto LAB_01c26635;
                                  uVar3 = vptestmd_avx512vl(auVar39,auVar39);
                                  iVar113 = *(int *)(local_4e0.hit + 4);
                                  iVar284 = *(int *)(local_4e0.hit + 8);
                                  iVar33 = *(int *)(local_4e0.hit + 0xc);
                                  iVar34 = *(int *)(local_4e0.hit + 0x10);
                                  iVar35 = *(int *)(local_4e0.hit + 0x14);
                                  iVar36 = *(int *)(local_4e0.hit + 0x18);
                                  iVar37 = *(int *)(local_4e0.hit + 0x1c);
                                  bVar40 = (byte)uVar3;
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = SUB81(uVar3 >> 7,0);
                                  *(uint *)(local_4e0.ray + 0x180) =
                                       (uint)(bVar40 & 1) * *(int *)local_4e0.hit |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_4e0.ray + 0x180);
                                  *(uint *)(local_4e0.ray + 0x184) =
                                       (uint)bVar22 * iVar113 |
                                       (uint)!bVar22 * *(int *)(local_4e0.ray + 0x184);
                                  *(uint *)(local_4e0.ray + 0x188) =
                                       (uint)bVar16 * iVar284 |
                                       (uint)!bVar16 * *(int *)(local_4e0.ray + 0x188);
                                  *(uint *)(local_4e0.ray + 0x18c) =
                                       (uint)bVar17 * iVar33 |
                                       (uint)!bVar17 * *(int *)(local_4e0.ray + 0x18c);
                                  *(uint *)(local_4e0.ray + 400) =
                                       (uint)bVar18 * iVar34 |
                                       (uint)!bVar18 * *(int *)(local_4e0.ray + 400);
                                  *(uint *)(local_4e0.ray + 0x194) =
                                       (uint)bVar19 * iVar35 |
                                       (uint)!bVar19 * *(int *)(local_4e0.ray + 0x194);
                                  *(uint *)(local_4e0.ray + 0x198) =
                                       (uint)bVar20 * iVar36 |
                                       (uint)!bVar20 * *(int *)(local_4e0.ray + 0x198);
                                  *(uint *)(local_4e0.ray + 0x19c) =
                                       (uint)bVar21 * iVar37 |
                                       (uint)!bVar21 * *(int *)(local_4e0.ray + 0x19c);
                                  iVar113 = *(int *)(local_4e0.hit + 0x24);
                                  iVar284 = *(int *)(local_4e0.hit + 0x28);
                                  iVar33 = *(int *)(local_4e0.hit + 0x2c);
                                  iVar34 = *(int *)(local_4e0.hit + 0x30);
                                  iVar35 = *(int *)(local_4e0.hit + 0x34);
                                  iVar36 = *(int *)(local_4e0.hit + 0x38);
                                  iVar37 = *(int *)(local_4e0.hit + 0x3c);
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = SUB81(uVar3 >> 7,0);
                                  *(uint *)(local_4e0.ray + 0x1a0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_4e0.hit + 0x20) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_4e0.ray + 0x1a0);
                                  *(uint *)(local_4e0.ray + 0x1a4) =
                                       (uint)bVar22 * iVar113 |
                                       (uint)!bVar22 * *(int *)(local_4e0.ray + 0x1a4);
                                  *(uint *)(local_4e0.ray + 0x1a8) =
                                       (uint)bVar16 * iVar284 |
                                       (uint)!bVar16 * *(int *)(local_4e0.ray + 0x1a8);
                                  *(uint *)(local_4e0.ray + 0x1ac) =
                                       (uint)bVar17 * iVar33 |
                                       (uint)!bVar17 * *(int *)(local_4e0.ray + 0x1ac);
                                  *(uint *)(local_4e0.ray + 0x1b0) =
                                       (uint)bVar18 * iVar34 |
                                       (uint)!bVar18 * *(int *)(local_4e0.ray + 0x1b0);
                                  *(uint *)(local_4e0.ray + 0x1b4) =
                                       (uint)bVar19 * iVar35 |
                                       (uint)!bVar19 * *(int *)(local_4e0.ray + 0x1b4);
                                  *(uint *)(local_4e0.ray + 0x1b8) =
                                       (uint)bVar20 * iVar36 |
                                       (uint)!bVar20 * *(int *)(local_4e0.ray + 0x1b8);
                                  *(uint *)(local_4e0.ray + 0x1bc) =
                                       (uint)bVar21 * iVar37 |
                                       (uint)!bVar21 * *(int *)(local_4e0.ray + 0x1bc);
                                  iVar113 = *(int *)(local_4e0.hit + 0x44);
                                  iVar284 = *(int *)(local_4e0.hit + 0x48);
                                  iVar33 = *(int *)(local_4e0.hit + 0x4c);
                                  iVar34 = *(int *)(local_4e0.hit + 0x50);
                                  iVar35 = *(int *)(local_4e0.hit + 0x54);
                                  iVar36 = *(int *)(local_4e0.hit + 0x58);
                                  iVar37 = *(int *)(local_4e0.hit + 0x5c);
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = SUB81(uVar3 >> 7,0);
                                  *(uint *)(local_4e0.ray + 0x1c0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_4e0.hit + 0x40) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_4e0.ray + 0x1c0);
                                  *(uint *)(local_4e0.ray + 0x1c4) =
                                       (uint)bVar22 * iVar113 |
                                       (uint)!bVar22 * *(int *)(local_4e0.ray + 0x1c4);
                                  *(uint *)(local_4e0.ray + 0x1c8) =
                                       (uint)bVar16 * iVar284 |
                                       (uint)!bVar16 * *(int *)(local_4e0.ray + 0x1c8);
                                  *(uint *)(local_4e0.ray + 0x1cc) =
                                       (uint)bVar17 * iVar33 |
                                       (uint)!bVar17 * *(int *)(local_4e0.ray + 0x1cc);
                                  *(uint *)(local_4e0.ray + 0x1d0) =
                                       (uint)bVar18 * iVar34 |
                                       (uint)!bVar18 * *(int *)(local_4e0.ray + 0x1d0);
                                  *(uint *)(local_4e0.ray + 0x1d4) =
                                       (uint)bVar19 * iVar35 |
                                       (uint)!bVar19 * *(int *)(local_4e0.ray + 0x1d4);
                                  *(uint *)(local_4e0.ray + 0x1d8) =
                                       (uint)bVar20 * iVar36 |
                                       (uint)!bVar20 * *(int *)(local_4e0.ray + 0x1d8);
                                  *(uint *)(local_4e0.ray + 0x1dc) =
                                       (uint)bVar21 * iVar37 |
                                       (uint)!bVar21 * *(int *)(local_4e0.ray + 0x1dc);
                                  iVar113 = *(int *)(local_4e0.hit + 100);
                                  iVar284 = *(int *)(local_4e0.hit + 0x68);
                                  iVar33 = *(int *)(local_4e0.hit + 0x6c);
                                  iVar34 = *(int *)(local_4e0.hit + 0x70);
                                  iVar35 = *(int *)(local_4e0.hit + 0x74);
                                  iVar36 = *(int *)(local_4e0.hit + 0x78);
                                  iVar37 = *(int *)(local_4e0.hit + 0x7c);
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = SUB81(uVar3 >> 7,0);
                                  *(uint *)(local_4e0.ray + 0x1e0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_4e0.hit + 0x60) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_4e0.ray + 0x1e0);
                                  *(uint *)(local_4e0.ray + 0x1e4) =
                                       (uint)bVar22 * iVar113 |
                                       (uint)!bVar22 * *(int *)(local_4e0.ray + 0x1e4);
                                  *(uint *)(local_4e0.ray + 0x1e8) =
                                       (uint)bVar16 * iVar284 |
                                       (uint)!bVar16 * *(int *)(local_4e0.ray + 0x1e8);
                                  *(uint *)(local_4e0.ray + 0x1ec) =
                                       (uint)bVar17 * iVar33 |
                                       (uint)!bVar17 * *(int *)(local_4e0.ray + 0x1ec);
                                  *(uint *)(local_4e0.ray + 0x1f0) =
                                       (uint)bVar18 * iVar34 |
                                       (uint)!bVar18 * *(int *)(local_4e0.ray + 0x1f0);
                                  *(uint *)(local_4e0.ray + 500) =
                                       (uint)bVar19 * iVar35 |
                                       (uint)!bVar19 * *(int *)(local_4e0.ray + 500);
                                  *(uint *)(local_4e0.ray + 0x1f8) =
                                       (uint)bVar20 * iVar36 |
                                       (uint)!bVar20 * *(int *)(local_4e0.ray + 0x1f8);
                                  *(uint *)(local_4e0.ray + 0x1fc) =
                                       (uint)bVar21 * iVar37 |
                                       (uint)!bVar21 * *(int *)(local_4e0.ray + 0x1fc);
                                  iVar113 = *(int *)(local_4e0.ray + 0x204);
                                  iVar284 = *(int *)(local_4e0.ray + 0x208);
                                  iVar33 = *(int *)(local_4e0.ray + 0x20c);
                                  iVar34 = *(int *)(local_4e0.ray + 0x210);
                                  iVar35 = *(int *)(local_4e0.ray + 0x214);
                                  iVar36 = *(int *)(local_4e0.ray + 0x218);
                                  iVar37 = *(int *)(local_4e0.ray + 0x21c);
                                  auVar107._0_4_ =
                                       (uint)(bVar40 & 1) * *(int *)(local_4e0.hit + 0x80) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_4e0.ray + 0x200);
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  auVar107._4_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x84) |
                                       (uint)!bVar22 * iVar113;
                                  bVar22 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar107._8_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x88) |
                                       (uint)!bVar22 * iVar284;
                                  bVar22 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar107._12_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x8c) |
                                       (uint)!bVar22 * iVar33;
                                  bVar22 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar107._16_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x90) |
                                       (uint)!bVar22 * iVar34;
                                  bVar22 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar107._20_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x94) |
                                       (uint)!bVar22 * iVar35;
                                  bVar22 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar107._24_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x98) |
                                       (uint)!bVar22 * iVar36;
                                  bVar22 = SUB81(uVar3 >> 7,0);
                                  auVar107._28_4_ =
                                       (uint)bVar22 * *(int *)(local_4e0.hit + 0x9c) |
                                       (uint)!bVar22 * iVar37;
                                  *(undefined1 (*) [32])(local_4e0.ray + 0x200) = auVar107;
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  uVar112 = bVar22 * auVar107._4_4_ | (uint)!bVar22 * iVar113;
                                  auVar29._4_24_ = auVar107._8_24_;
                                  auVar29._0_4_ = uVar112;
                                  auVar108._0_8_ = auVar29._0_8_ << 0x20;
                                  bVar22 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar108._8_4_ = bVar22 * auVar107._8_4_ | (uint)!bVar22 * iVar284
                                  ;
                                  bVar22 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar108._12_4_ =
                                       bVar22 * auVar107._12_4_ | (uint)!bVar22 * iVar33;
                                  bVar22 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar108._16_4_ =
                                       bVar22 * auVar107._16_4_ | (uint)!bVar22 * iVar34;
                                  bVar22 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar108._20_4_ =
                                       bVar22 * auVar107._20_4_ | (uint)!bVar22 * iVar35;
                                  bVar22 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar108._24_4_ =
                                       bVar22 * auVar107._24_4_ | (uint)!bVar22 * iVar36;
                                  bVar22 = SUB81(uVar3 >> 7,0);
                                  auVar108._28_4_ =
                                       bVar22 * auVar107._28_4_ | (uint)!bVar22 * iVar37;
                                  auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4e0.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_4e0.ray + 0x220) = auVar91;
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  uVar112 = bVar22 * uVar112 | (uint)!bVar22 * iVar113;
                                  auVar30._4_24_ = auVar108._8_24_;
                                  auVar30._0_4_ = uVar112;
                                  auVar109._0_8_ = auVar30._0_8_ << 0x20;
                                  bVar22 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar109._8_4_ = bVar22 * auVar108._8_4_ | (uint)!bVar22 * iVar284
                                  ;
                                  bVar22 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar109._12_4_ =
                                       bVar22 * auVar108._12_4_ | (uint)!bVar22 * iVar33;
                                  bVar22 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar109._16_4_ =
                                       bVar22 * auVar108._16_4_ | (uint)!bVar22 * iVar34;
                                  bVar22 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar109._20_4_ =
                                       bVar22 * auVar108._20_4_ | (uint)!bVar22 * iVar35;
                                  bVar22 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar109._24_4_ =
                                       bVar22 * auVar108._24_4_ | (uint)!bVar22 * iVar36;
                                  bVar22 = SUB81(uVar3 >> 7,0);
                                  auVar109._28_4_ =
                                       bVar22 * auVar108._28_4_ | (uint)!bVar22 * iVar37;
                                  auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4e0.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_4e0.ray + 0x240) = auVar91;
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  uVar112 = bVar22 * uVar112 | (uint)!bVar22 * iVar113;
                                  auVar31._4_24_ = auVar109._8_24_;
                                  auVar31._0_4_ = uVar112;
                                  auVar110._0_8_ = auVar31._0_8_ << 0x20;
                                  bVar22 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar110._8_4_ = bVar22 * auVar109._8_4_ | (uint)!bVar22 * iVar284
                                  ;
                                  bVar22 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar110._12_4_ =
                                       bVar22 * auVar109._12_4_ | (uint)!bVar22 * iVar33;
                                  bVar22 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar110._16_4_ =
                                       bVar22 * auVar109._16_4_ | (uint)!bVar22 * iVar34;
                                  bVar22 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar110._20_4_ =
                                       bVar22 * auVar109._20_4_ | (uint)!bVar22 * iVar35;
                                  bVar22 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar110._24_4_ =
                                       bVar22 * auVar109._24_4_ | (uint)!bVar22 * iVar36;
                                  bVar22 = SUB81(uVar3 >> 7,0);
                                  auVar110._28_4_ =
                                       bVar22 * auVar109._28_4_ | (uint)!bVar22 * iVar37;
                                  auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4e0.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_4e0.ray + 0x260) = auVar91;
                                  bVar22 = (bool)((byte)(uVar3 >> 1) & 1);
                                  auVar32._4_24_ = auVar110._8_24_;
                                  auVar32._0_4_ = bVar22 * uVar112 | (uint)!bVar22 * iVar113;
                                  auVar111._0_8_ = auVar32._0_8_ << 0x20;
                                  bVar22 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar111._8_4_ = bVar22 * auVar110._8_4_ | (uint)!bVar22 * iVar284
                                  ;
                                  bVar22 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar111._12_4_ =
                                       bVar22 * auVar110._12_4_ | (uint)!bVar22 * iVar33;
                                  bVar22 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar111._16_4_ =
                                       bVar22 * auVar110._16_4_ | (uint)!bVar22 * iVar34;
                                  bVar22 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar111._20_4_ =
                                       bVar22 * auVar110._20_4_ | (uint)!bVar22 * iVar35;
                                  bVar22 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar111._24_4_ =
                                       bVar22 * auVar110._24_4_ | (uint)!bVar22 * iVar36;
                                  bVar22 = SUB81(uVar3 >> 7,0);
                                  auVar111._28_4_ =
                                       bVar22 * auVar110._28_4_ | (uint)!bVar22 * iVar37;
                                  auVar91._16_16_ = auVar111._16_16_;
                                  auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_4e0.hit + 0x100));
                                  *(undefined1 (*) [32])(local_4e0.ray + 0x280) = auVar87;
                                }
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar282 = ZEXT1664(auVar50);
                                auVar91._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar280 = ZEXT1664(auVar91._0_16_);
                              }
                              auVar278 = ZEXT1664(auVar62);
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar45 = lVar45 + -1;
              } while (lVar45 != 0);
            }
          }
          else {
            auVar282 = ZEXT1664(auVar120);
            auVar91._0_16_ = auVar61;
          }
        }
      }
    } while (bVar15);
    auVar50 = vinsertps_avx512f(auVar106._0_16_,auVar63,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }